

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.c
# Opt level: O3

ZyanStatus ZydisDecodeInstruction(ZydisDecoderState *state,ZydisDecodedInstruction *instruction)

{
  ZyanU8 ZVar1;
  undefined2 uVar2;
  ZydisMachineMode ZVar3;
  ZydisInstructionEncoding ZVar4;
  ZydisMnemonic ZVar5;
  ushort *puVar6;
  uint3 uVar7;
  bool bVar8;
  ulong *puVar9;
  undefined8 *puVar10;
  char cVar11;
  ZyanU8 ZVar12;
  ZyanBool ZVar13;
  ushort uVar14;
  short sVar15;
  ZyanU16 ZVar16;
  ZyanStatus status_047620348;
  ZydisOpcodeMap ZVar17;
  ZyanStatus ZVar18;
  uint uVar19;
  ZydisInstructionCategory ZVar20;
  uint uVar21;
  ZydisMaskMode ZVar22;
  ZydisDecoderTreeNode *node;
  ZydisDecoderTreeNode *pZVar23;
  byte *pbVar24;
  ZydisDecoderTreeNode *pZVar25;
  ulong uVar26;
  sbyte sVar27;
  ZyanU8 size;
  byte bVar28;
  ZydisMaskMode ZVar29;
  ZyanUSize ZVar30;
  ZydisBranchType ZVar31;
  int iVar32;
  undefined1 *puVar33;
  undefined2 *puVar34;
  ZyanU8 *pZVar35;
  byte bVar36;
  ZydisBroadcastMode ZVar37;
  ulong uVar38;
  long lVar39;
  undefined3 *puVar40;
  byte bVar41;
  byte bVar42;
  byte bVar43;
  byte bVar44;
  byte bVar45;
  byte bVar46;
  ZydisDecoderContext *pZVar47;
  bool bVar48;
  bool bVar49;
  ZyanU16 index;
  ZyanU8 prefix_bytes [4];
  ZydisInstructionDefinitionLEGACY *def;
  ZydisDefinitionAccessedFlags *flags;
  ZydisInstructionEncodingInfo *info;
  ZyanU16 local_a4;
  char local_a2;
  ZyanBool local_a1;
  undefined8 local_a0;
  uint local_98;
  byte local_92;
  byte local_91;
  undefined4 local_90;
  uint local_8c;
  byte *local_88;
  uint local_7c;
  byte *local_78;
  ulong local_70;
  ulong local_68;
  undefined4 local_5c;
  ulong local_58;
  ZydisMnemonic *local_50;
  ZydisDecoderContext *local_48;
  ZydisDefinitionAccessedFlags *local_40;
  ZydisInstructionEncodingInfo *local_38;
  
  if (state == (ZydisDecoderState *)0x0) {
    __assert_fail("state",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0x1248,
                  "ZyanStatus ZydisDecodeInstruction(ZydisDecoderState *, ZydisDecodedInstruction *)"
                 );
  }
  local_88 = (byte *)((long)&(instruction->raw).field_3 + 3);
  local_78 = (byte *)((long)&(instruction->raw).field_3 + 4);
  pZVar25 = (ZydisDecoderTreeNode *)0x0;
  node = &zydis_decoder_tree_root;
LAB_001179a4:
  do {
    pZVar23 = pZVar25;
    local_a4 = 0;
    switch(node->type) {
    case '\0':
      if (pZVar23 == (ZydisDecoderTreeNode *)0x0) {
        return 0x80200001;
      }
      ZVar12 = (state->prefixes).mandatory_candidate;
      if (ZVar12 != '\0') {
        bVar41 = (state->prefixes).offset_mandatory;
        (instruction->raw).prefixes[bVar41].type = ZYDIS_PREFIX_TYPE_IGNORED;
        if (ZVar12 == 'f') {
          if ((state->prefixes).offset_osz_override == bVar41) {
            (instruction->raw).prefixes[bVar41].type = ZYDIS_PREFIX_TYPE_EFFECTIVE;
          }
          instruction->attributes = instruction->attributes | 0x80000000000;
        }
      }
      pZVar25 = (ZydisDecoderTreeNode *)0x0;
      node = pZVar23;
      goto LAB_001179a4;
    case '\x01':
      if (instruction->encoding == ZYDIS_INSTRUCTION_ENCODING_LEGACY) {
LAB_00117cec:
        ZVar16 = 0;
      }
      else {
        if (instruction->encoding != ZYDIS_INSTRUCTION_ENCODING_XOP) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0xde4,
                        "ZyanStatus ZydisNodeHandlerXOP(const ZydisDecodedInstruction *, ZyanU16 *)"
                       );
        }
        if ((instruction->attributes & 8) == 0) {
          __assert_fail("instruction->attributes & (1ULL << 3)",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0xde0,
                        "ZyanStatus ZydisNodeHandlerXOP(const ZydisDecodedInstruction *, ZyanU16 *)"
                       );
        }
        bVar41 = (instruction->raw).field_3.xop.pp;
        ZVar16 = ((ushort)(instruction->raw).field_3.rex.B + (ushort)bVar41 + (ushort)bVar41 * 2) -
                 7;
      }
      break;
    case '\x02':
      if (instruction->encoding == ZYDIS_INSTRUCTION_ENCODING_LEGACY) goto LAB_00117cec;
      if (instruction->encoding != ZYDIS_INSTRUCTION_ENCODING_REQUIRED_BITS) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0xdf8,
                      "ZyanStatus ZydisNodeHandlerVEX(const ZydisDecodedInstruction *, ZyanU16 *)");
      }
      if ((instruction->attributes & 0x10) == 0) {
        __assert_fail("instruction->attributes & (1ULL << 4)",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0xdf4,
                      "ZyanStatus ZydisNodeHandlerVEX(const ZydisDecodedInstruction *, ZyanU16 *)");
      }
      ZVar16 = (ushort)(instruction->raw).field_3.rex.B +
               (ushort)(instruction->raw).field_3.xop.pp * 4 + 1;
      break;
    case '\x03':
      ZVar4 = instruction->encoding;
      if (ZVar4 == ZYDIS_INSTRUCTION_ENCODING_LEGACY) goto LAB_00117cec;
      if (ZVar4 == ZYDIS_INSTRUCTION_ENCODING_MAX_VALUE) {
        if ((instruction->attributes & 0x40) == 0) {
          __assert_fail("instruction->attributes & (1ULL << 6)",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0xe0c,
                        "ZyanStatus ZydisNodeHandlerEMVEX(const ZydisDecodedInstruction *, ZyanU16 *)"
                       );
        }
        sVar15 = 0x21;
        sVar27 = 2;
      }
      else {
        if (ZVar4 != ZYDIS_INSTRUCTION_ENCODING_EVEX) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0xe10,
                        "ZyanStatus ZydisNodeHandlerEMVEX(const ZydisDecodedInstruction *, ZyanU16 *)"
                       );
        }
        if ((instruction->attributes & 0x20) == 0) {
          __assert_fail("instruction->attributes & (1ULL << 5)",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0xe08,
                        "ZyanStatus ZydisNodeHandlerEMVEX(const ZydisDecodedInstruction *, ZyanU16 *)"
                       );
        }
        sVar15 = 1;
        sVar27 = 3;
      }
      ZVar16 = sVar15 + (ushort)(instruction->raw).field_3.rex.offset +
               ((ushort)(instruction->raw).field_3.xop.pp << sVar27);
      break;
    case '\x04':
      if (instruction->encoding == ZYDIS_INSTRUCTION_ENCODING_3DNOW) {
        local_a4 = 0xc;
        ZVar16 = local_a4;
      }
      else {
        if (instruction->encoding == ZYDIS_INSTRUCTION_ENCODING_LEGACY) {
          bVar41 = instruction->length;
          if (0xe < bVar41) {
            return 0x80200002;
          }
          if (state->buffer_len == 0) {
            return 0x80200000;
          }
          pbVar24 = state->buffer;
          state->buffer = pbVar24 + 1;
          bVar28 = *pbVar24;
          instruction->opcode = bVar28;
          ZVar12 = bVar41 + 1;
          instruction->length = ZVar12;
          ZVar30 = state->buffer_len;
          uVar26 = ZVar30 - 1;
          state->buffer_len = uVar26;
          ZVar17 = instruction->opcode_map;
          if (ZYDIS_OPCODE_MAP_MAX_VALUE < ZVar17) {
LAB_0011a10b:
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                          ,0xed5,
                          "ZyanStatus ZydisNodeHandlerOpcode(ZydisDecoderState *, ZydisDecodedInstruction *, ZyanU16 *)"
                         );
          }
          if ((0xe0cU >> (ZVar17 & 0x1f) & 1) == 0) {
            if (ZVar17 == ZYDIS_OPCODE_MAP_DEFAULT) {
              if (bVar28 < 0xc4) {
                if (bVar28 == 0xf) {
                  instruction->opcode_map = ZYDIS_OPCODE_MAP_0F;
                }
                else {
                  if (bVar28 == 0x62) goto LAB_00118174;
                  if (bVar28 == 0x8f) {
                    if (bVar41 == 0xe) {
                      return 0x80200002;
                    }
                    if (uVar26 == 0) {
                      return 0x80200000;
                    }
                    if ((*state->buffer & 0x18) != 0) {
                      if ((instruction->attributes & 4) != 0) {
                        return 0x80200006;
                      }
                      if ((state->prefixes).has_lock != '\0') {
                        return 0x80200004;
                      }
                      if ((state->prefixes).mandatory_candidate != '\0') {
                        return 0x80200005;
                      }
                      (instruction->raw).field_3.xop.offset = bVar41;
                      local_a0._0_1_ = 0x8f;
                      if (ZVar12 == '\x0e') {
                        return 0x80200002;
                      }
                      uVar26 = state->buffer_len;
                      if (uVar26 < 2) {
                        return 0x80200000;
                      }
                      instruction->length = bVar41 + 3;
                      uVar2 = *(undefined2 *)state->buffer;
                      local_a0._1_1_ = (ZyanU8)uVar2;
                      local_a0._2_1_ = (undefined1)((ushort)uVar2 >> 8);
                      state->buffer = state->buffer + 2;
                      state->buffer_len = uVar26 - 2;
                      instruction->encoding = ZYDIS_INSTRUCTION_ENCODING_XOP;
                      ZVar18 = ZydisDecodeXOP(state->context,instruction,(ZyanU8 *)&local_a0);
                      if ((int)ZVar18 < 0) {
                        return ZVar18;
                      }
                      ZVar17 = (instruction->raw).field_3.rex.B + ZYDIS_OPCODE_MAP_0F;
                      goto LAB_00118366;
                    }
                  }
                }
              }
              else if (bVar28 - 0xc4 < 2) {
LAB_00118174:
                if (bVar41 == 0xe) {
                  return 0x80200002;
                }
                if (uVar26 == 0) {
                  return 0x80200000;
                }
                puVar6 = (ushort *)state->buffer;
                if ((0xbf < (byte)*puVar6) ||
                   (instruction->machine_mode == ZYDIS_MACHINE_MODE_LONG_64)) {
                  uVar38 = instruction->attributes;
                  if ((uVar38 & 4) != 0) {
                    return 0x80200006;
                  }
                  if ((state->prefixes).has_lock != '\0') {
                    return 0x80200004;
                  }
                  if ((state->prefixes).mandatory_candidate != '\0') {
                    return 0x80200005;
                  }
                  local_a0._1_1_ = 0;
                  local_a0._2_1_ = 0;
                  local_a0._3_1_ = 0;
                  local_a0._0_1_ = bVar28;
                  if (bVar28 == 0x62) {
                    if ((uVar38 & 0x20) != 0) {
                      __assert_fail("!(instruction->attributes & (1ULL << 5))",
                                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                                    ,0xe51,
                                    "ZyanStatus ZydisNodeHandlerOpcode(ZydisDecoderState *, ZydisDecodedInstruction *, ZyanU16 *)"
                                   );
                    }
                    if ((uVar38 & 0x40) != 0) {
                      __assert_fail("!(instruction->attributes & (1ULL << 6))",
                                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                                    ,0xe52,
                                    "ZyanStatus ZydisNodeHandlerOpcode(ZydisDecoderState *, ZydisDecodedInstruction *, ZyanU16 *)"
                                   );
                    }
                    if (0xb < bVar41) {
                      return 0x80200002;
                    }
                    if (uVar26 < 3) {
                      return 0x80200000;
                    }
                    instruction->length = bVar41 + 4;
                    local_a0._3_1_ = (byte)puVar6[1];
                    uVar14 = *puVar6;
                    local_a0._1_1_ = (ZyanU8)uVar14;
                    local_a0._2_1_ = (undefined1)(uVar14 >> 8);
                    state->buffer = (byte *)((long)puVar6 + 3);
                    state->buffer_len = ZVar30 - 4;
                    if ((uVar14 & 0x400) == 0) {
                      (instruction->raw).field_3.evex.V2 = bVar41;
                      if (state->decoder->machine_mode != ZYDIS_MACHINE_MODE_LONG_64) {
                        return 0x80200001;
                      }
                      instruction->encoding = ZYDIS_INSTRUCTION_ENCODING_MAX_VALUE;
                      ZVar18 = ZydisDecodeMVEX(state->context,instruction,(ZyanU8 *)&local_a0);
                      pbVar24 = local_78;
                    }
                    else {
                      (instruction->raw).field_3.evex.offset = bVar41;
                      instruction->encoding = ZYDIS_INSTRUCTION_ENCODING_EVEX;
                      ZVar18 = ZydisDecodeEVEX(state->context,instruction,(ZyanU8 *)&local_a0);
                      pbVar24 = local_78;
                    }
                  }
                  else {
                    if (bVar28 == 0xc5) {
                      (instruction->raw).field_3.xop.offset = bVar41;
                      if ((uVar38 & 0x10) != 0) {
                        __assert_fail("!(instruction->attributes & (1ULL << 4))",
                                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                                      ,0xe4b,
                                      "ZyanStatus ZydisNodeHandlerOpcode(ZydisDecoderState *, ZydisDecodedInstruction *, ZyanU16 *)"
                                     );
                      }
                      ZVar30 = state->buffer_len;
                      if (ZVar30 == 0) {
                        return 0x80200000;
                      }
                      pZVar35 = state->buffer;
                      state->buffer = pZVar35 + 1;
                      local_a0._1_1_ = *pZVar35;
                      instruction->length = bVar41 + 2;
                      ZVar30 = ZVar30 - 1;
                    }
                    else {
                      if (bVar28 != 0xc4) {
                        __assert_fail("0",
                                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                                      ,0xe59,
                                      "ZyanStatus ZydisNodeHandlerOpcode(ZydisDecoderState *, ZydisDecodedInstruction *, ZyanU16 *)"
                                     );
                      }
                      (instruction->raw).field_3.xop.offset = bVar41;
                      if ((uVar38 & 0x10) != 0) {
                        __assert_fail("!(instruction->attributes & (1ULL << 4))",
                                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                                      ,0xe45,
                                      "ZyanStatus ZydisNodeHandlerOpcode(ZydisDecoderState *, ZydisDecodedInstruction *, ZyanU16 *)"
                                     );
                      }
                      if (ZVar12 == '\x0e') {
                        return 0x80200002;
                      }
                      uVar26 = state->buffer_len;
                      if (uVar26 < 2) {
                        return 0x80200000;
                      }
                      instruction->length = bVar41 + 3;
                      uVar2 = *(undefined2 *)state->buffer;
                      local_a0._1_1_ = (ZyanU8)uVar2;
                      local_a0._2_1_ = (undefined1)((ushort)uVar2 >> 8);
                      state->buffer = state->buffer + 2;
                      ZVar30 = uVar26 - 2;
                    }
                    state->buffer_len = ZVar30;
                    instruction->encoding = ZYDIS_INSTRUCTION_ENCODING_REQUIRED_BITS;
                    ZVar18 = ZydisDecodeVEX(state->context,instruction,(ZyanU8 *)&local_a0);
                    pbVar24 = local_88;
                  }
                  if ((int)ZVar18 < 0) {
                    return ZVar18;
                  }
                  ZVar17 = (ZydisOpcodeMap)*pbVar24;
LAB_00118366:
                  instruction->opcode_map = ZVar17;
                }
              }
            }
            else {
              if (ZVar17 != ZYDIS_OPCODE_MAP_0F) goto LAB_0011a10b;
              if (bVar28 == 0x3a) {
                instruction->opcode_map = ZYDIS_OPCODE_MAP_0F3A;
              }
              else if (bVar28 == 0x38) {
                instruction->opcode_map = ZYDIS_OPCODE_MAP_0F38;
              }
              else if (bVar28 == 0xf) {
                if ((state->prefixes).has_lock != '\0') {
                  return 0x80200004;
                }
                instruction->encoding = ZYDIS_INSTRUCTION_ENCODING_3DNOW;
                instruction->opcode_map = ZYDIS_OPCODE_MAP_0F0F;
              }
            }
          }
        }
        else {
          bVar41 = instruction->length;
          if (0xe < bVar41) {
            return 0x80200002;
          }
          if (state->buffer_len == 0) {
            return 0x80200000;
          }
          pZVar35 = state->buffer;
          state->buffer = pZVar35 + 1;
          instruction->opcode = *pZVar35;
          instruction->length = bVar41 + 1;
          state->buffer_len = state->buffer_len - 1;
        }
        ZVar16 = (ushort)instruction->opcode;
      }
      break;
    case '\x05':
      if (5 < (ulong)instruction->machine_mode) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0xefa,
                      "ZyanStatus ZydisNodeHandlerMode(const ZydisDecodedInstruction *, ZyanU16 *)")
        ;
      }
      ZVar16 = *(ZyanU16 *)(&DAT_00123b80 + (ulong)instruction->machine_mode * 2);
      break;
    case '\x06':
      bVar48 = instruction->machine_mode == ZYDIS_MACHINE_MODE_LONG_64;
      goto LAB_00117e61;
    case '\a':
      ZVar18 = ZydisNodeHandlerModrmMod(state,instruction,&local_a4);
      ZVar16 = local_a4;
      if ((int)ZVar18 < 0) {
        return ZVar18;
      }
      break;
    case '\b':
      ZVar18 = ZydisNodeHandlerModrmMod(state,instruction,&local_a4);
      if ((int)ZVar18 < 0) {
        return ZVar18;
      }
      bVar48 = local_a4 == 3;
      goto LAB_00117e61;
    case '\t':
      if ((instruction->raw).modrm.offset == '\0') {
        bVar41 = instruction->length;
        (instruction->raw).modrm.offset = bVar41;
        if (0xe < bVar41) {
          return 0x80200002;
        }
        ZVar30 = state->buffer_len;
        if (ZVar30 == 0) {
          return 0x80200000;
        }
        pZVar35 = state->buffer;
        state->buffer = pZVar35 + 1;
        ZVar12 = *pZVar35;
        instruction->length = bVar41 + 1;
        state->buffer_len = ZVar30 - 1;
        ZydisDecodeModRM(instruction,ZVar12);
      }
      ZVar16 = (ushort)(instruction->raw).modrm.reg;
      break;
    case '\n':
      if ((instruction->raw).modrm.offset == '\0') {
        bVar41 = instruction->length;
        (instruction->raw).modrm.offset = bVar41;
        if (0xe < bVar41) {
          return 0x80200002;
        }
        ZVar30 = state->buffer_len;
        if (ZVar30 == 0) {
          return 0x80200000;
        }
        pZVar35 = state->buffer;
        state->buffer = pZVar35 + 1;
        ZVar12 = *pZVar35;
        instruction->length = bVar41 + 1;
        state->buffer_len = ZVar30 - 1;
        ZydisDecodeModRM(instruction,ZVar12);
      }
      ZVar16 = (ushort)(instruction->raw).modrm.rm;
      break;
    case '\v':
      bVar48 = (state->prefixes).group1 == '\0';
LAB_00117e61:
      ZVar16 = (ushort)!bVar48;
      break;
    case '\f':
      ZVar12 = (state->prefixes).mandatory_candidate;
      if (ZVar12 == 0xf3) {
        (instruction->raw).prefixes[(state->prefixes).offset_mandatory].type =
             ZYDIS_PREFIX_TYPE_MANDATORY;
        local_a4 = 3;
      }
      else if (ZVar12 == 0xf2) {
        (instruction->raw).prefixes[(state->prefixes).offset_mandatory].type =
             ZYDIS_PREFIX_TYPE_MANDATORY;
        local_a4 = 4;
      }
      else {
        local_a4 = 1;
        if (ZVar12 == 'f') {
          (instruction->raw).prefixes[(state->prefixes).offset_mandatory].type =
               ZYDIS_PREFIX_TYPE_MANDATORY;
          pbVar24 = (byte *)((long)&instruction->attributes + 5);
          *pbVar24 = *pbVar24 & 0xf7;
          local_a4 = 2;
        }
      }
      pZVar23 = ZydisDecoderTreeGetChildNode(node,0);
      ZVar16 = local_a4;
      break;
    case '\r':
      ZVar3 = instruction->machine_mode;
      if ((ZVar3 != ZYDIS_MACHINE_MODE_LONG_64) ||
         (ZVar16 = 2, (state->context->vector_unified).W == '\0')) {
        uVar26 = instruction->attributes;
        if ((uVar26 & 0x80000000000) != 0) {
          (instruction->raw).prefixes[(state->prefixes).offset_osz_override].type =
               ZYDIS_PREFIX_TYPE_EFFECTIVE;
        }
        if (ZYDIS_MACHINE_MODE_MAX_VALUE < ZVar3) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0xf88,
                        "ZyanStatus ZydisNodeHandlerOperandSize(const ZydisDecoderState *, ZydisDecodedInstruction *, ZyanU16 *)"
                       );
        }
        if ((0xbU >> (ZVar3 & 0x1f) & 1) == 0) {
          uVar14 = (ushort)(uint)(uVar26 >> 0x2b);
          goto LAB_00117f0d;
        }
        ZVar16 = (ushort)((uVar26 & 0x80000000000) == 0);
      }
      break;
    case '\x0e':
      ZVar3 = instruction->machine_mode;
      if (ZYDIS_MACHINE_MODE_MAX_VALUE < ZVar3) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0xfa8,
                      "ZyanStatus ZydisNodeHandlerAddressSize(ZydisDecodedInstruction *, ZyanU16 *)"
                     );
      }
      if ((0x34U >> (ZVar3 & 0x1f) & 1) == 0) {
        if ((10U >> (ZVar3 & 0x1f) & 1) == 0) {
          ZVar16 = ((instruction->attributes & 0x100000000000) == 0) + 1;
        }
        else {
          ZVar16 = (ushort)((instruction->attributes & 0x100000000000) == 0);
        }
      }
      else {
        uVar14 = (ushort)(uint)(instruction->attributes >> 0x2c);
LAB_00117f0d:
        ZVar16 = uVar14 & 1;
      }
      break;
    case '\x0f':
      if (state->context == (ZydisDecoderContext *)0x0) {
        __assert_fail("context",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0xfb1,
                      "ZyanStatus ZydisNodeHandlerVectorLength(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                     );
      }
      switch(instruction->encoding) {
      case ZYDIS_INSTRUCTION_ENCODING_XOP:
        if ((instruction->attributes & 8) == 0) {
          __assert_fail("instruction->attributes & (1ULL << 3)",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0xfb8,
                        "ZyanStatus ZydisNodeHandlerVectorLength(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                       );
        }
        break;
      case ZYDIS_INSTRUCTION_ENCODING_REQUIRED_BITS:
        if ((instruction->attributes & 0x10) == 0) {
          __assert_fail("instruction->attributes & (1ULL << 4)",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0xfbb,
                        "ZyanStatus ZydisNodeHandlerVectorLength(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                       );
        }
        break;
      case ZYDIS_INSTRUCTION_ENCODING_EVEX:
        if ((instruction->attributes & 0x20) == 0) {
          __assert_fail("instruction->attributes & (1ULL << 5)",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0xfbe,
                        "ZyanStatus ZydisNodeHandlerVectorLength(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                       );
        }
        break;
      case ZYDIS_INSTRUCTION_ENCODING_MAX_VALUE:
        if ((instruction->attributes & 0x40) == 0) {
          __assert_fail("instruction->attributes & (1ULL << 6)",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0xfc1,
                        "ZyanStatus ZydisNodeHandlerVectorLength(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                       );
        }
        break;
      default:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0xfc4,
                      "ZyanStatus ZydisNodeHandlerVectorLength(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                     );
      }
      ZVar16 = (ZyanU16)(state->context->vector_unified).LL;
      if (ZVar16 == 3) {
        return 0x80200001;
      }
      break;
    case '\x10':
      if (state->context == (ZydisDecoderContext *)0x0) {
        __assert_fail("context",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0xfd2,
                      "ZyanStatus ZydisNodeHandlerRexW(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                     );
      }
      switch(instruction->encoding) {
      case ZYDIS_INSTRUCTION_ENCODING_LEGACY:
        break;
      default:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0xfe8,
                      "ZyanStatus ZydisNodeHandlerRexW(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                     );
      case ZYDIS_INSTRUCTION_ENCODING_XOP:
        if ((instruction->attributes & 8) == 0) {
          __assert_fail("instruction->attributes & (1ULL << 3)",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0xfdc,
                        "ZyanStatus ZydisNodeHandlerRexW(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                       );
        }
        break;
      case ZYDIS_INSTRUCTION_ENCODING_REQUIRED_BITS:
        if ((instruction->attributes & 0x10) == 0) {
          __assert_fail("instruction->attributes & (1ULL << 4)",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0xfdf,
                        "ZyanStatus ZydisNodeHandlerRexW(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                       );
        }
        break;
      case ZYDIS_INSTRUCTION_ENCODING_EVEX:
        if ((instruction->attributes & 0x20) == 0) {
          __assert_fail("instruction->attributes & (1ULL << 5)",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0xfe2,
                        "ZyanStatus ZydisNodeHandlerRexW(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                       );
        }
        break;
      case ZYDIS_INSTRUCTION_ENCODING_MAX_VALUE:
        if ((instruction->attributes & 0x40) == 0) {
          __assert_fail("instruction->attributes & (1ULL << 6)",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0xfe5,
                        "ZyanStatus ZydisNodeHandlerRexW(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                       );
        }
      }
      ZVar16 = (ushort)(state->context->vector_unified).W;
      break;
    case '\x11':
      if (state->context == (ZydisDecoderContext *)0x0) {
        __assert_fail("context",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0xff1,
                      "ZyanStatus ZydisNodeHandlerRexB(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                     );
      }
      switch(instruction->encoding) {
      case ZYDIS_INSTRUCTION_ENCODING_LEGACY:
        break;
      default:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0x1007,
                      "ZyanStatus ZydisNodeHandlerRexB(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                     );
      case ZYDIS_INSTRUCTION_ENCODING_XOP:
        if ((instruction->attributes & 8) == 0) {
          __assert_fail("instruction->attributes & (1ULL << 3)",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0xffb,
                        "ZyanStatus ZydisNodeHandlerRexB(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                       );
        }
        break;
      case ZYDIS_INSTRUCTION_ENCODING_REQUIRED_BITS:
        if ((instruction->attributes & 0x10) == 0) {
          __assert_fail("instruction->attributes & (1ULL << 4)",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0xffe,
                        "ZyanStatus ZydisNodeHandlerRexB(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                       );
        }
        break;
      case ZYDIS_INSTRUCTION_ENCODING_EVEX:
        if ((instruction->attributes & 0x20) == 0) {
          __assert_fail("instruction->attributes & (1ULL << 5)",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0x1001,
                        "ZyanStatus ZydisNodeHandlerRexB(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                       );
        }
        break;
      case ZYDIS_INSTRUCTION_ENCODING_MAX_VALUE:
        if ((instruction->attributes & 0x40) == 0) {
          __assert_fail("instruction->attributes & (1ULL << 6)",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0x1004,
                        "ZyanStatus ZydisNodeHandlerRexB(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                       );
        }
      }
      ZVar16 = (ushort)(state->context->vector_unified).B;
      break;
    case '\x12':
      if (instruction->encoding != ZYDIS_INSTRUCTION_ENCODING_EVEX) {
        __assert_fail("instruction->encoding == ZYDIS_INSTRUCTION_ENCODING_EVEX",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0x1013,
                      "ZyanStatus ZydisNodeHandlerEvexB(const ZydisDecodedInstruction *, ZyanU16 *)"
                     );
      }
      if ((instruction->attributes & 0x20) == 0) {
        __assert_fail("instruction->attributes & (1ULL << 5)",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0x1014,
                      "ZyanStatus ZydisNodeHandlerEvexB(const ZydisDecodedInstruction *, ZyanU16 *)"
                     );
      }
      ZVar16 = (ushort)(instruction->raw).field_3.evex.b;
      break;
    case '\x13':
      if (instruction->encoding != ZYDIS_INSTRUCTION_ENCODING_MAX_VALUE) {
        __assert_fail("instruction->encoding == ZYDIS_INSTRUCTION_ENCODING_MVEX",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0x1020,
                      "ZyanStatus ZydisNodeHandlerMvexE(const ZydisDecodedInstruction *, ZyanU16 *)"
                     );
      }
      if ((instruction->attributes & 0x40) == 0) {
        __assert_fail("instruction->attributes & (1ULL << 6)",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0x1021,
                      "ZyanStatus ZydisNodeHandlerMvexE(const ZydisDecodedInstruction *, ZyanU16 *)"
                     );
      }
      ZVar16 = (ushort)(instruction->raw).field_3.xop.offset;
      break;
    case '\x14':
      uVar14 = (ushort)state->decoder->decoder_mode >> 1;
      goto LAB_00117ebd;
    case '\x15':
      uVar14 = (ushort)state->decoder->decoder_mode >> 2;
      goto LAB_00117ebd;
    case '\x16':
      uVar14 = (ushort)state->decoder->decoder_mode >> 3;
      goto LAB_00117ebd;
    case '\x17':
      uVar14 = (ushort)state->decoder->decoder_mode >> 4;
      goto LAB_00117ebd;
    case '\x18':
      uVar14 = (ushort)state->decoder->decoder_mode >> 5;
      goto LAB_00117ebd;
    case '\x19':
      uVar14 = (ushort)state->decoder->decoder_mode >> 6;
      goto LAB_00117ebd;
    case '\x1a':
      uVar14 = (ushort)state->decoder->decoder_mode >> 7;
      goto LAB_00117ebd;
    case '\x1b':
      uVar14 = (ushort)*(byte *)((long)&state->decoder->decoder_mode + 1);
      goto LAB_00117ebd;
    case '\x1c':
      uVar14 = (ushort)state->decoder->decoder_mode >> 9;
      goto LAB_00117ebd;
    case '\x1d':
      uVar14 = (ushort)state->decoder->decoder_mode >> 10;
LAB_00117ebd:
      ZVar16 = uVar14 & 1;
      break;
    default:
      goto switchD_001179c1_default;
    }
    local_a4 = ZVar16;
    node = ZydisDecoderTreeGetChildNode(node,local_a4);
    pZVar25 = pZVar23;
  } while( true );
switchD_001192e3_caseD_4:
  if (0xbf < bVar44) {
    __assert_fail("def->element_size < (sizeof(scales) / sizeof((scales)[0]))",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0x9f1,
                  "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                 );
  }
  ZVar12 = *(ZyanU8 *)((long)&ZydisSetAVXInformation_scales_82 + (ulong)(bVar44 >> 5));
  goto LAB_00119fe9;
switchD_001179c1_default:
  if (-1 < (char)node->type) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0x131c,
                  "ZyanStatus ZydisDecodeInstruction(ZydisDecoderState *, ZydisDecodedInstruction *)"
                 );
  }
  ZydisGetInstructionDefinition
            (instruction->encoding,node->value,(ZydisInstructionDefinition **)&local_a0);
  pZVar47 = state->context;
  if (pZVar47 == (ZydisDecoderContext *)0x0) {
    __assert_fail("context",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0xd1a,
                  "void ZydisSetEffectiveOperandWidth(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                 );
  }
  puVar9 = (ulong *)CONCAT44(local_a0._4_4_,
                             CONCAT13(local_a0._3_1_,
                                      CONCAT12(local_a0._2_1_,
                                               CONCAT11(local_a0._1_1_,(byte)local_a0))));
  if (puVar9 == (ulong *)0x0) {
    __assert_fail("definition",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0xd1c,
                  "void ZydisSetEffectiveOperandWidth(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                 );
  }
  uVar26 = instruction->attributes;
  bVar41 = (byte)(uVar26 >> 0x2b) & 1;
  ZVar3 = instruction->machine_mode;
  if (ZVar3 == ZYDIS_MACHINE_MODE_LONG_64) {
    bVar41 = bVar41 | (pZVar47->vector_unified).W * '\x02' & 2 | 4;
  }
  else if ((ZVar3 == ZYDIS_MACHINE_MODE_LEGACY_32) || (ZVar3 == ZYDIS_MACHINE_MODE_LONG_COMPAT_32))
  {
    bVar41 = bVar41 | 2;
  }
  bVar41 = ZydisSetEffectiveOperandWidth_operand_size_map
           [(ulong)bVar41 + (ulong)((uint)(*puVar9 >> 0x21) & 7) * 8];
  instruction->operand_width = bVar41;
  pZVar47->eosz_index = bVar41 >> 5;
  if ((*puVar9 & 0xe00000000) == 0x200000000) {
    instruction->operand_width = '\b';
  }
  bVar41 = (byte)(uVar26 >> 0x2c) & 1;
  if (ZVar3 == ZYDIS_MACHINE_MODE_LONG_64) {
    bVar41 = bVar41 | 4;
  }
  else if ((ZVar3 == ZYDIS_MACHINE_MODE_LEGACY_32) || (ZVar3 == ZYDIS_MACHINE_MODE_LONG_COMPAT_32))
  {
    bVar41 = bVar41 | 2;
  }
  uVar26 = (ulong)((uint)(*puVar9 >> 0x24) & 3);
  if (uVar26 == 3) {
    __assert_fail("definition->address_size_map < (sizeof(address_size_map) / sizeof((address_size_map)[0]))"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0xdcc,
                  "void ZydisSetEffectiveAddressWidth(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                 );
  }
  bVar41 = ZydisSetEffectiveAddressWidth_address_size_map[(ulong)bVar41 + uVar26 * 8];
  instruction->address_width = bVar41;
  pZVar47->easz_index = bVar41 >> 5;
  ZydisGetInstructionEncodingInfo(node,&local_38);
  if (local_38 == (ZydisInstructionEncodingInfo *)0x0) {
    __assert_fail("info",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0xc95,
                  "ZyanStatus ZydisDecodeOptionalInstructionParts(ZydisDecoderState *, ZydisDecodedInstruction *, const ZydisInstructionEncodingInfo *)"
                 );
  }
  pZVar47 = state->context;
  bVar41 = local_38->flags;
  if ((bVar41 & 1) != 0) {
    if ((instruction->raw).modrm.offset == '\0') {
      bVar41 = instruction->length;
      (instruction->raw).modrm.offset = bVar41;
      if (0xe < bVar41) {
        return 0x80200002;
      }
      ZVar30 = state->buffer_len;
      if (ZVar30 == 0) {
        return 0x80200000;
      }
      pZVar35 = state->buffer;
      state->buffer = pZVar35 + 1;
      ZVar12 = *pZVar35;
      instruction->length = bVar41 + 1;
      state->buffer_len = ZVar30 - 1;
      ZydisDecodeModRM(instruction,ZVar12);
      bVar41 = local_38->flags;
    }
    if ((bVar41 & 0x10) == 0) {
      ZVar12 = instruction->address_width;
      if ((ZVar12 == '@') || (ZVar12 == ' ')) {
        ZVar12 = (instruction->raw).modrm.mod;
        bVar28 = 1;
        if (ZVar12 == '\x03') goto LAB_001186b5;
        ZVar1 = (instruction->raw).modrm.rm;
        if (ZVar12 == '\x02') {
          size = ' ';
LAB_001185b1:
          bVar48 = false;
        }
        else {
          if (ZVar12 == '\x01') {
            size = '\b';
            goto LAB_001185b1;
          }
          if (ZVar12 != '\0') {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                          ,0xcd7,
                          "ZyanStatus ZydisDecodeOptionalInstructionParts(ZydisDecoderState *, ZydisDecodedInstruction *, const ZydisInstructionEncodingInfo *)"
                         );
          }
          if (ZVar1 == '\x05') {
            size = ' ';
            if (instruction->machine_mode == ZYDIS_MACHINE_MODE_LONG_64) {
              *(byte *)&instruction->attributes = (byte)instruction->attributes | 0x80;
            }
            goto LAB_00118689;
          }
          bVar48 = true;
          size = '\0';
        }
        if (ZVar1 == '\x04') {
          bVar28 = instruction->length;
          (instruction->raw).sib.offset = bVar28;
          if (0xe < bVar28) {
            return 0x80200002;
          }
          ZVar30 = state->buffer_len;
          if (ZVar30 == 0) {
            return 0x80200000;
          }
          pbVar24 = state->buffer;
          state->buffer = pbVar24 + 1;
          bVar42 = *pbVar24;
          instruction->length = bVar28 + 1;
          state->buffer_len = ZVar30 - 1;
          uVar26 = instruction->attributes;
          if ((uVar26 & 1) == 0) {
            __assert_fail("instruction->attributes & (1ULL << 0)",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                          ,0x2c0,"void ZydisDecodeSIB(ZydisDecodedInstruction *, ZyanU8)");
          }
          if ((uVar26 & 2) != 0) {
            __assert_fail("!(instruction->attributes & (1ULL << 1))",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                          ,0x2c2,"void ZydisDecodeSIB(ZydisDecodedInstruction *, ZyanU8)");
          }
          instruction->attributes = uVar26 | 2;
          (instruction->raw).sib.scale = bVar42 >> 6;
          (instruction->raw).sib.index = bVar42 >> 3 & 7;
          (instruction->raw).sib.base = bVar42 & 7;
          if ((bVar42 & 7) == 5) {
            size = ' ';
            if (ZVar12 == '\x01') {
              size = '\b';
            }
            goto LAB_00118689;
          }
        }
        if (!bVar48) goto LAB_00118689;
        goto LAB_001186a2;
      }
      if (ZVar12 != '\x10') {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0xcdb,
                      "ZyanStatus ZydisDecodeOptionalInstructionParts(ZydisDecoderState *, ZydisDecodedInstruction *, const ZydisInstructionEncodingInfo *)"
                     );
      }
      switch((instruction->raw).modrm.mod) {
      case '\0':
        size = '\x10';
        if ((instruction->raw).modrm.rm == '\x06') break;
        goto LAB_001186ad;
      case '\x01':
        size = '\b';
        break;
      case '\x02':
        size = '\x10';
        break;
      case '\x03':
        bVar28 = 1;
        goto LAB_001186b5;
      default:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0xcbb,
                      "ZyanStatus ZydisDecodeOptionalInstructionParts(ZydisDecoderState *, ZydisDecodedInstruction *, const ZydisInstructionEncodingInfo *)"
                     );
      }
LAB_00118689:
      ZVar18 = ZydisReadDisplacement(state,instruction,size);
      if ((int)ZVar18 < 0) {
        return ZVar18;
      }
      bVar41 = local_38->flags;
    }
LAB_001186a2:
    bVar28 = 1;
    if ((instruction->raw).modrm.mod != '\x03') {
LAB_001186ad:
      bVar28 = bVar41 >> 4 & 1;
    }
LAB_001186b5:
    (pZVar47->reg_info).is_mod_reg = bVar28;
  }
  if ((bVar41 & 2) != 0) {
    ZVar18 = ZydisReadDisplacement(state,instruction,(local_38->disp).size[pZVar47->easz_index]);
    if ((int)ZVar18 < 0) {
      return ZVar18;
    }
    bVar41 = local_38->flags;
  }
  if ((bVar41 & 4) != 0) {
    ZVar13 = local_38->imm[0].is_relative;
    if (ZVar13 != '\0') {
      *(byte *)&instruction->attributes = (byte)instruction->attributes | 0x80;
    }
    ZVar18 = ZydisReadImmediate(state,instruction,'\0',local_38->imm[0].size[pZVar47->eosz_index],
                                local_38->imm[0].is_signed,ZVar13);
    if ((int)ZVar18 < 0) {
      return ZVar18;
    }
    bVar41 = local_38->flags;
  }
  if ((bVar41 & 8) != 0) {
    if ((bVar41 & 2) != 0) {
      __assert_fail("!(info->flags & 0x02)",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0xd05,
                    "ZyanStatus ZydisDecodeOptionalInstructionParts(ZydisDecoderState *, ZydisDecodedInstruction *, const ZydisInstructionEncodingInfo *)"
                   );
    }
    ZVar18 = ZydisReadImmediate(state,instruction,'\x01',local_38->imm[1].size[pZVar47->eosz_index],
                                local_38->imm[1].is_signed,local_38->imm[1].is_relative);
    if ((int)ZVar18 < 0) {
      return ZVar18;
    }
  }
  local_50 = (ZydisMnemonic *)
             CONCAT44(local_a0._4_4_,
                      CONCAT13(local_a0._3_1_,
                               CONCAT12(local_a0._2_1_,CONCAT11(local_a0._1_1_,(byte)local_a0))));
  if (local_50 == (ZydisMnemonic *)0x0) {
    __assert_fail("definition",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0x1103,
                  "ZyanStatus ZydisCheckErrorConditions(ZydisDecoderState *, const ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                 );
  }
  ZVar4 = instruction->encoding;
  uVar26 = (ulong)ZVar4;
  if (5 < uVar26) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0x119e,
                  "ZyanStatus ZydisCheckErrorConditions(ZydisDecoderState *, const ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                 );
  }
  ZVar5 = local_50[2];
  bVar48 = true;
  local_78 = (byte *)uVar26;
  switch(uVar26) {
  case 0:
    if ((((ulong)*(undefined8 *)local_50 >> 0x2d & 1) != 0) &&
       (instruction->machine_mode == ZYDIS_MACHINE_MODE_MAX_VALUE)) {
      return 0x80200001;
    }
    if ((((ulong)*(undefined8 *)local_50 >> 0x2e & 1) != 0) &&
       (instruction->machine_mode - ZYDIS_MACHINE_MODE_LONG_COMPAT_32 < 2)) {
      return 0x80200001;
    }
    local_98 = 0;
    local_70 = 0;
    local_68 = 0;
    local_88 = (byte *)0x0;
    if ((state->prefixes).has_lock != '\0' && -1 < (int)ZVar5) {
      return 0x80200004;
    }
    break;
  case 1:
    local_98 = 0;
    local_70 = 0;
    local_68 = 0;
    local_88 = (byte *)0x0;
    break;
  case 2:
    local_88 = (byte *)((ulong)CONCAT41((uint)((uint5)*(undefined5 *)(local_50 + 2) >> 0x26),
                                        (char)((uint5)*(undefined5 *)(local_50 + 2) >> 0x1e)) &
                       0xffffffffffffff1f);
    local_98 = 0;
    local_70 = 0;
    local_68 = 0;
    break;
  case 3:
    uVar26 = (ulong)((uint6)*(undefined6 *)(local_50 + 2) >> 0x1e);
    uVar14 = CONCAT11((char)((ushort)(short)local_50[3] >> 8),(byte)(short)local_50[3] >> 3);
    bVar48 = (*(undefined6 *)(local_50 + 2) & 0x2000000000) == ZYDIS_MNEMONIC_INVALID;
    local_98 = 0;
    goto LAB_00118997;
  case 4:
    local_88 = (byte *)((ulong)CONCAT41((uint)((uint5)*(undefined5 *)(local_50 + 2) >> 0x26),
                                        (char)((uint5)*(undefined5 *)(local_50 + 2) >> 0x1e)) &
                       0xffffffffffffff1f);
    local_68 = (ulong)((byte)(char)local_50[3] >> 3) & 0xffffffffffffff01;
    local_70 = (ulong)((byte)(char)local_50[3] >> 4 & 1);
    local_98 = *(ushort *)((long)local_50 + 0xe) >> 2 & 3;
    if (((instruction->raw).field_3.xop.offset != '\0') &&
       ((*(ushort *)((long)local_50 + 0xe) & 0x10) == 0)) {
      return 0x8020000a;
    }
    break;
  case 5:
    uVar2 = (undefined2)local_50[3];
    uVar26 = (ulong)((ushort)uVar2 >> 6 & 0x1f);
    if (0x19 < uVar26) {
      __assert_fail("def->functionality < (sizeof(lookup) / sizeof((lookup)[0]))",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0x1192,
                    "ZyanStatus ZydisCheckErrorConditions(ZydisDecoderState *, const ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    uVar38 = (ulong)(instruction->raw).field_3.vex.size;
    if (7 < uVar38) {
      __assert_fail("instruction->raw.mvex.SSS < 8",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0x1193,
                    "ZyanStatus ZydisCheckErrorConditions(ZydisDecoderState *, const ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    if (ZydisCheckErrorConditions_lookup[uVar38 + uVar26 * 8] == '\0') {
      return 0x80200001;
    }
    uVar7 = CONCAT12(*(byte *)((long)local_50 + 0xe),uVar2);
    uVar26 = (ulong)CONCAT31(uVar7 >> 6,(char)(CONCAT34(uVar7,local_50[2]) >> 0x1e));
    uVar14 = CONCAT11((char)((ushort)uVar2 >> 8),(byte)uVar2 >> 3);
    local_98 = (ushort)uVar2 >> 0xb & 3;
LAB_00118997:
    local_68 = (ulong)uVar14 & 0xffffffffffffff01;
    local_88 = (byte *)(uVar26 & 0xffffffffffffff1f);
    local_70 = 0;
  }
  bVar41 = (byte)(ZVar5 >> 0xd);
  local_91 = bVar41 & 0x1f;
  uVar19 = ZVar5 >> 0x12;
  pZVar47 = state->context;
  local_a1 = (pZVar47->reg_info).is_mod_reg;
  local_8c = 0;
  local_7c = (uint)(bVar41 & 0xf);
  if ((ZVar5 >> 0xd & 0x1f) == 0) {
    local_7c = 0;
  }
  bVar41 = (byte)((ulong)uVar19 & 0xffffffffffffff1f);
  if (bVar41 == 0) {
LAB_00118a13:
    local_90 = 0;
LAB_00118a1b:
    local_92 = (instruction->raw).modrm.rm;
  }
  else {
    if (local_a1 != '\0') {
      local_8c = uVar19 & 0xffffff0f;
      local_90 = (undefined4)
                 CONCAT71((int7)(((ulong)uVar19 & 0xffffffffffffff1f) >> 8),0xf < bVar41);
      goto LAB_00118a1b;
    }
    local_8c = uVar19 & 0xffffff07;
    if ((((uVar19 & 8) == 0) || (state->decoder->machine_mode != ZYDIS_MACHINE_MODE_LONG_64)) ||
       ((instruction->raw).modrm.mod != '\0')) goto LAB_00118a13;
    local_92 = (instruction->raw).modrm.rm;
    if (local_92 == 5) {
      return 0x80200003;
    }
    local_90 = 0;
  }
  bVar49 = local_92 == 4;
  bVar8 = local_a1 == '\0';
  bVar42 = (byte)local_8c;
  bVar41 = (instruction->raw).modrm.reg;
  bVar28 = (pZVar47->vector_unified).vvvv;
  uVar26 = (ulong)local_7c;
  if (instruction->machine_mode == ZYDIS_MACHINE_MODE_LONG_64) {
    bVar44 = (pZVar47->vector_unified).V2 << 4;
    bVar36 = bVar44;
    if (bVar42 != 4 || (!bVar49 || !bVar8)) {
      bVar36 = 0;
    }
    ZVar12 = (pZVar47->vector_unified).X;
    bVar45 = ZVar12 << 4;
    if (ZVar4 < ZYDIS_INSTRUCTION_ENCODING_EVEX) {
      bVar45 = 0;
    }
    bVar43 = (pZVar47->vector_unified).B << 3;
    if (local_a1 == '\0') {
      bVar46 = 0xff;
    }
    else {
      bVar46 = ZydisPopulateRegisterIds_mask_rm[bVar42];
    }
    bVar46 = bVar46 & (local_92 | bVar43 | bVar45);
    bVar44 = bVar44 | bVar28;
    bVar43 = bVar43 | *(ZyanU8 *)
                       ((long)((instruction->raw).imm + -1) + (ulong)(bVar49 && bVar8) * 4 + 1);
    bVar36 = bVar36 | (instruction->raw).sib.index | ZVar12 << 3;
    bVar41 = ((pZVar47->vector_unified).R << 3 | (pZVar47->vector_unified).R2 << 4 | bVar41) &
             ZydisPopulateRegisterIds_mask_reg[uVar26];
    local_5c = 0;
    local_a2 = bVar48;
    local_58 = uVar26;
    local_48 = pZVar47;
  }
  else {
    bVar44 = bVar28 & 7;
    bVar43 = *(ZyanU8 *)((long)((instruction->raw).imm + -1) + (ulong)(bVar49 && bVar8) * 4 + 1);
    bVar36 = (instruction->raw).sib.index;
    bVar46 = local_92;
  }
  if ((char)local_88 == '\0') {
    if (bVar28 != 0) {
      return 0x80200003;
    }
    if ((bVar42 != 4 || (!bVar49 || !bVar8)) && ((pZVar47->vector_unified).V2 != '\0')) {
      return 0x80200003;
    }
  }
  bVar49 = instruction->machine_mode == ZYDIS_MACHINE_MODE_LONG_64;
  if ((byte)ZydisPopulateRegisterIds_available_regs[uVar26 + (ulong)bVar49 * 0xc] <= bVar41) {
    return 0x80200003;
  }
  if ((byte)ZydisPopulateRegisterIds_available_regs[((ulong)local_88 & 0xff) + (ulong)bVar49 * 0xc]
      <= bVar44) {
    return 0x80200003;
  }
  if ((local_a1 != '\0') &&
     ((byte)ZydisPopulateRegisterIds_available_regs[(ulong)bVar42 + (ulong)bVar49 * 0xc] <= bVar46))
  {
    return 0x80200003;
  }
  bVar28 = 0xff;
  if ((char)local_7c == '\b') {
    bVar28 = bVar41;
  }
  bVar45 = bVar46;
  if (bVar42 != 8) {
    bVar45 = bVar28;
  }
  if (local_a1 == '\0') {
    bVar45 = bVar28;
  }
  if (-1 < (char)bVar45) {
    if (0xf < bVar45) {
      __assert_fail("(ZyanUSize)id_cr < (sizeof(lookup) / sizeof((lookup)[0]))",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0x10e1,
                    "ZyanStatus ZydisPopulateRegisterIds(ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU8, ZyanU8, ZyanU8)"
                   );
    }
    if ((0xfee2UL >> ((ulong)bVar45 & 0x3f) & 1) != 0) {
      return 0x80200003;
    }
  }
  bVar28 = -((char)local_7c == '\0') | bVar41;
  (pZVar47->reg_info).id_reg = bVar28;
  bVar46 = -(local_a1 == '\0') | -(bVar42 == 0) | bVar46;
  (pZVar47->reg_info).id_rm = bVar46;
  bVar45 = -((char)local_88 == '\0') | bVar44;
  (pZVar47->reg_info).id_ndsndd = bVar45;
  (pZVar47->reg_info).id_base = bVar43;
  (pZVar47->reg_info).id_index = bVar36;
  if (0xf < local_91 && bVar28 == 1) {
    return 0x80200003;
  }
  if (((byte)local_90 & bVar46 == 1) != 0) {
    return 0x80200003;
  }
  if ((char)local_68 != '\0') {
    if ((instruction->raw).modrm.mod == '\x03') {
      local_a2 = bVar48;
      __assert_fail("instruction->raw.modrm.mod != 3",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0x11d7,
                    "ZyanStatus ZydisCheckErrorConditions(ZydisDecoderState *, const ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    if (local_92 != 4) {
      local_a2 = bVar48;
      __assert_fail("instruction->raw.modrm.rm == 4",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0x11d8,
                    "ZyanStatus ZydisCheckErrorConditions(ZydisDecoderState *, const ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    bVar43 = bVar28;
    if (ZVar4 == ZYDIS_INSTRUCTION_ENCODING_REQUIRED_BITS) {
      if ((((char)local_7c != '\x04') || (bVar42 != 4)) || ((char)local_88 != '\x04')) {
        local_a2 = bVar48;
        __assert_fail("(def_reg == ZYDIS_REGKIND_VR) && (def_rm == ZYDIS_MEMOP_TYPE_VSIB) && (def_ndsndd == ZYDIS_REGKIND_VR)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0x11e2,
                      "ZyanStatus ZydisCheckErrorConditions(ZydisDecoderState *, const ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      }
    }
    else {
      bVar44 = 0xf0;
      if ((ZVar4 & ~ZYDIS_INSTRUCTION_ENCODING_3DNOW) == ZYDIS_INSTRUCTION_ENCODING_EVEX) {
        if ((((char)local_88 != '\0') || ((local_7c & 0xb) != 0)) || (bVar42 != 4)) {
          local_a2 = bVar48;
          __assert_fail("((def_reg == ZYDIS_REGKIND_INVALID) || (def_reg == ZYDIS_REGKIND_VR)) && (def_rm == ZYDIS_MEMOP_TYPE_VSIB) && (def_ndsndd == ZYDIS_REGKIND_INVALID)"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0x11ec,
                        "ZyanStatus ZydisCheckErrorConditions(ZydisDecoderState *, const ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                       );
        }
        bVar43 = bVar41;
        bVar44 = 0xf0;
        if ((char)local_7c == '\0') {
          bVar43 = 0xf1;
        }
      }
    }
    if (bVar43 == bVar36) {
      return 0x80200003;
    }
    if (bVar44 == bVar43) {
      return 0x80200003;
    }
    if (bVar44 == bVar36) {
      return 0x80200003;
    }
  }
  if ((char)local_70 != '\0') {
    if (1 < ZVar4 - ZYDIS_INSTRUCTION_ENCODING_REQUIRED_BITS) {
      local_a2 = bVar48;
      __assert_fail("(instruction->encoding == ZYDIS_INSTRUCTION_ENCODING_EVEX) || (instruction->encoding == ZYDIS_INSTRUCTION_ENCODING_VEX)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0x1202,
                    "ZyanStatus ZydisCheckErrorConditions(ZydisDecoderState *, const ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    if (bVar28 == bVar45) {
      return 0x80200003;
    }
    if (local_a1 != '\0' && bVar28 == bVar46) {
      return 0x80200003;
    }
  }
  if (bVar48 == false) {
    if (ZVar4 != ZYDIS_INSTRUCTION_ENCODING_REQUIRED_BITS) {
      local_a2 = bVar48;
      __assert_fail("instruction->encoding == ZYDIS_INSTRUCTION_ENCODING_VEX",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0x1212,
                    "ZyanStatus ZydisCheckErrorConditions(ZydisDecoderState *, const ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    if (local_a1 == '\0') {
      local_a2 = bVar48;
      __assert_fail("is_reg",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0x1213,
                    "ZyanStatus ZydisCheckErrorConditions(ZydisDecoderState *, const ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    if (bVar28 == bVar45) {
      return 0x80200003;
    }
    if (bVar45 == bVar46) {
      return 0x80200003;
    }
    if (bVar28 == bVar46) {
      return 0x80200003;
    }
  }
  if (1 < local_98) {
    if (local_98 == 3) {
      if ((pZVar47->vector_unified).mask != '\0') {
        return 0x8020000a;
      }
    }
    else if ((pZVar47->vector_unified).mask == '\0') {
      return 0x8020000a;
    }
  }
  local_a2 = bVar48;
  if (ZVar4 == ZYDIS_INSTRUCTION_ENCODING_3DNOW) {
    bVar41 = instruction->length;
    if (0xe < bVar41) {
      return 0x80200002;
    }
    if (state->buffer_len == 0) {
      return 0x80200000;
    }
    pZVar35 = state->buffer;
    state->buffer = pZVar35 + 1;
    instruction->opcode = *pZVar35;
    instruction->length = bVar41 + 1;
    state->buffer_len = state->buffer_len - 1;
    pZVar25 = ZydisDecoderTreeGetChildNode(&zydis_decoder_tree_root,0xf);
    pZVar25 = ZydisDecoderTreeGetChildNode(pZVar25,0xf);
    pZVar25 = ZydisDecoderTreeGetChildNode(pZVar25,(ushort)instruction->opcode);
    if (pZVar25->type == '\0') {
      return 0x80200001;
    }
    if (pZVar25->type != '\b') {
      __assert_fail("node->type == ZYDIS_NODETYPE_FILTER_MODRM_MOD_COMPACT",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0x12e6,
                    "ZyanStatus ZydisDecodeInstruction(ZydisDecoderState *, ZydisDecodedInstruction *)"
                   );
    }
    pZVar25 = ZydisDecoderTreeGetChildNode(pZVar25,(ushort)((instruction->raw).modrm.mod != '\x03'))
    ;
    if (-1 < (char)pZVar25->type) {
      __assert_fail("node->type & ZYDIS_NODETYPE_DEFINITION_MASK",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0x12e9,
                    "ZyanStatus ZydisDecodeInstruction(ZydisDecoderState *, ZydisDecodedInstruction *)"
                   );
    }
    ZydisGetInstructionDefinition
              (instruction->encoding,pZVar25->value,(ZydisInstructionDefinition **)&local_a0);
    local_50 = (ZydisMnemonic *)
               CONCAT44(local_a0._4_4_,
                        CONCAT13(local_a0._3_1_,
                                 CONCAT12(local_a0._2_1_,CONCAT11(local_a0._1_1_,(byte)local_a0))));
    pZVar47 = state->context;
  }
  instruction->mnemonic = *local_50 & (ZYDIS_MNEMONIC_XSHA256|ZYDIS_MNEMONIC_FUCOM);
  instruction->operand_count = (byte)(*local_50 >> 0xb) & 0xf;
  instruction->operand_count_visible = (byte)(*local_50 >> 0xf) & 7;
  pZVar47->definition = local_50;
  puVar10 = (undefined8 *)
            CONCAT44(local_a0._4_4_,
                     CONCAT13(local_a0._3_1_,
                              CONCAT12(local_a0._2_1_,CONCAT11(local_a0._1_1_,(byte)local_a0))));
  ZVar20 = (ZydisInstructionCategory)((ulong)*puVar10 >> 0x2f) &
           (ZYDIS_CATEGORY_WRMSRNS|ZYDIS_CATEGORY_BINARY);
  (instruction->meta).category = ZVar20;
  (instruction->meta).isa_set =
       (ZydisISASet)((ulong)*puVar10 >> 0x36) &
       (ZYDIS_ISA_SET_WAITPKG|ZYDIS_ISA_SET_AVX512_VBMI_256);
  (instruction->meta).isa_ext =
       (uint)((ulong)*puVar10 >> 0x3e) + *(int *)(puVar10 + 1) * 4 &
       (ZYDIS_ISA_EXT_VTX|ZYDIS_ISA_EXT_F16C);
  ZVar31 = *(uint *)(puVar10 + 1) >> 5 & ZYDIS_BRANCH_TYPE_FAR;
  (instruction->meta).branch_type = ZVar31;
  if (((ZVar31 != ZYDIS_BRANCH_TYPE_NONE) &&
      ((0x3c < ZVar20 - ZYDIS_CATEGORY_CALL ||
       ((0x1000000000000101U >> ((ulong)(ZVar20 - ZYDIS_CATEGORY_CALL) & 0x3f) & 1) == 0)))) &&
     (ZVar20 != ZYDIS_CATEGORY_UNCOND_BR)) {
    __assert_fail("(instruction->meta.branch_type == ZYDIS_BRANCH_TYPE_NONE) || ((instruction->meta.category == ZYDIS_CATEGORY_CALL) || (instruction->meta.category == ZYDIS_CATEGORY_COND_BR) || (instruction->meta.category == ZYDIS_CATEGORY_UNCOND_BR) || (instruction->meta.category == ZYDIS_CATEGORY_RET))"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0x12fd,
                  "ZyanStatus ZydisDecodeInstruction(ZydisDecoderState *, ZydisDecodedInstruction *)"
                 );
  }
  (instruction->meta).exception_class =
       *(uint *)(puVar10 + 1) >> 7 & (ZYDIS_EXCEPTION_CLASS_E10|ZYDIS_EXCEPTION_CLASS_E9NF);
  uVar19 = state->decoder->decoder_mode;
  if ((uVar19 & 1) != 0) {
    return 0x100000;
  }
  uVar21 = *(uint *)(puVar10 + 1);
  if ((uVar21 >> 0x17 & 3) != 0) {
    instruction->attributes =
         instruction->attributes |
         *(ulong *)(ZydisSetAttributes_mapping + (ulong)((byte)(uVar21 >> 0x17) & 3) * 8);
    uVar21 = *(uint *)(puVar10 + 1);
  }
  bVar41 = (byte)(uVar21 >> 0x19) & 3;
  if (bVar41 != 0) {
    instruction->attributes =
         instruction->attributes | *(ulong *)(ZydisSetAttributes_mapping_60 + (ulong)bVar41 * 8);
    uVar21 = *(uint *)(puVar10 + 1);
  }
  if ((uVar21 >> 0x1b & 3) != 0) {
    instruction->attributes =
         instruction->attributes |
         *(ulong *)(ZydisSetAttributes_mapping_62 + (ulong)((byte)(uVar21 >> 0x1b) & 3) * 8);
  }
  ZVar4 = instruction->encoding;
  if (ZVar4 - ZYDIS_INSTRUCTION_ENCODING_3DNOW < 5) {
    if ((*(byte *)((long)puVar10 + 0xb) & 0x20) != 0) {
      uVar26 = instruction->attributes;
      uVar38 = uVar26 | 0x4000000;
      instruction->attributes = uVar38;
      bVar41 = (state->prefixes).effective_segment;
      if (bVar41 < 0x36) {
        if (bVar41 != 0) {
          if (bVar41 == 0x26) {
            uVar38 = 0x10004000000;
          }
          else {
            if (bVar41 != 0x2e) goto LAB_0011a621;
            uVar38 = 0x2004000000;
          }
          goto LAB_001191d1;
        }
      }
      else {
        if (bVar41 < 100) {
          if (bVar41 == 0x36) {
            uVar38 = 0x4004000000;
          }
          else {
            if (bVar41 != 0x3e) {
LAB_0011a621:
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                            ,0x8cd,
                            "void ZydisSetAttributes(ZydisDecoderState *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                           );
            }
            uVar38 = 0x8004000000;
          }
        }
        else if (bVar41 == 100) {
          uVar38 = 0x20004000000;
        }
        else {
          if (bVar41 != 0x65) goto LAB_0011a621;
          uVar38 = 0x40004000000;
        }
LAB_001191d1:
        uVar38 = uVar38 | uVar26;
        instruction->attributes = uVar38;
      }
      if ((uVar38 & 0x7e000000000) != 0) goto LAB_001191e7;
    }
  }
  else {
    if (ZVar4 != ZYDIS_INSTRUCTION_ENCODING_LEGACY) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0x8d8,
                    "void ZydisSetAttributes(ZydisDecoderState *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    uVar21 = *(uint *)(puVar10 + 1);
    if ((uVar21 >> 0x1e & 1) != 0) {
      pbVar24 = (byte *)((long)&instruction->attributes + 1);
      *pbVar24 = *pbVar24 | 1;
      uVar21 = *(uint *)(puVar10 + 1);
    }
    if ((int)uVar21 < 0) {
      uVar26 = instruction->attributes;
      instruction->attributes = uVar26 | 0x10000;
      if ((state->prefixes).has_lock != '\0') {
        instruction->attributes = uVar26 | 0x8010000;
        (instruction->raw).prefixes[(state->prefixes).offset_lock].type =
             ZYDIS_PREFIX_TYPE_EFFECTIVE;
      }
    }
    uVar14 = *(ushort *)((long)puVar10 + 0xc);
    if ((uVar14 & 1) != 0) {
      pbVar24 = (byte *)((long)&instruction->attributes + 2);
      *pbVar24 = *pbVar24 | 2;
      uVar14 = *(ushort *)((long)puVar10 + 0xc);
    }
    if ((uVar14 & 2) != 0) {
      pbVar24 = (byte *)((long)&instruction->attributes + 2);
      *pbVar24 = *pbVar24 | 4;
      uVar14 = *(ushort *)((long)puVar10 + 0xc);
    }
    if ((uVar14 & 4) != 0) {
      pbVar24 = (byte *)((long)&instruction->attributes + 2);
      *pbVar24 = *pbVar24 | 8;
      uVar14 = *(ushort *)((long)puVar10 + 0xc);
    }
    if ((uVar14 & 8) != 0) {
      pbVar24 = (byte *)((long)&instruction->attributes + 2);
      *pbVar24 = *pbVar24 | 0x10;
      uVar14 = *(ushort *)((long)puVar10 + 0xc);
    }
    if ((uVar14 & 0x10) != 0) {
      pbVar24 = (byte *)((long)&instruction->attributes + 2);
      *pbVar24 = *pbVar24 | 0x20;
      uVar14 = *(ushort *)((long)puVar10 + 0xc);
    }
    cVar11 = (char)uVar14;
    if ((uVar14 & 0x20) != 0) {
      pbVar24 = (byte *)((long)&instruction->attributes + 2);
      *pbVar24 = *pbVar24 | 0x40;
      cVar11 = (char)*(undefined2 *)((long)puVar10 + 0xc);
    }
    if (cVar11 < '\0') {
      pbVar24 = (byte *)((long)&instruction->attributes + 2);
      *pbVar24 = *pbVar24 | 0x80;
    }
    ZVar12 = (state->prefixes).group1;
    if (ZVar12 == 0xf3) {
      uVar26 = instruction->attributes;
      uVar21 = (uint)uVar26;
      if ((uVar21 >> 0x11 & 1) == 0) {
        if ((uVar21 >> 0x12 & 1) == 0) {
          if (((uVar21 >> 0x16 & 1) == 0) ||
             (((uVar21 >> 0x1b & 1) == 0 && ((*(byte *)((long)puVar10 + 0xc) & 0x80) == 0))))
          goto LAB_00119789;
          uVar26 = uVar26 | 0x200000000;
        }
        else {
          uVar26 = uVar26 | 0x20000000;
        }
      }
      else {
        uVar26 = uVar26 | 0x10000000;
      }
LAB_00119785:
      instruction->attributes = uVar26;
    }
    else if (ZVar12 == 0xf2) {
      uVar26 = instruction->attributes;
      uVar21 = (uint)uVar26;
      if ((uVar21 >> 0x13 & 1) == 0) {
        if (((uVar21 >> 0x15 & 1) == 0) ||
           (((uVar21 >> 0x1b & 1) == 0 && ((*(byte *)((long)puVar10 + 0xc) & 0x80) == 0)))) {
          if ((uVar21 >> 0x14 & 1) == 0 || (uVar19 & 8) == 0) goto LAB_00119789;
          uVar26 = uVar26 | 0x80000000;
        }
        else {
          uVar26 = uVar26 | 0x100000000;
        }
      }
      else {
        uVar26 = uVar26 | 0x40000000;
      }
      goto LAB_00119785;
    }
LAB_00119789:
    bVar41 = (state->prefixes).offset_group1;
    if (((instruction->raw).prefixes[bVar41].type == ZYDIS_PREFIX_TYPE_IGNORED) &&
       ((instruction->attributes & 0x3f0000000) != 0)) {
      (instruction->raw).prefixes[bVar41].type = ZYDIS_PREFIX_TYPE_EFFECTIVE;
    }
    if ((*(byte *)((long)puVar10 + 0xd) & 1) != 0) {
      uVar26 = instruction->attributes;
      instruction->attributes = uVar26 | 0x1000000;
      ZVar12 = (state->prefixes).group2;
      if (ZVar12 == '.') {
        uVar38 = 0x401000000;
      }
      else {
        if (ZVar12 != '>') goto LAB_00119801;
        uVar38 = 0x801000000;
      }
      instruction->attributes = uVar38 | uVar26;
      (instruction->raw).prefixes[(state->prefixes).offset_group2].type =
           ZYDIS_PREFIX_TYPE_EFFECTIVE;
    }
LAB_00119801:
    if ((*(byte *)((long)puVar10 + 0xc) & 0x40) != 0) {
      uVar26 = instruction->attributes;
      instruction->attributes = uVar26 | 0x2000000;
      if (((uVar19 & 0x10) != 0) && (lVar39 = (long)(state->prefixes).offset_notrack, -1 < lVar39))
      {
        instruction->attributes = uVar26 | 0x1002000000;
        (instruction->raw).prefixes[lVar39].type = ZYDIS_PREFIX_TYPE_EFFECTIVE;
      }
    }
    if (((*(byte *)((long)puVar10 + 0xb) & 0x20) == 0) ||
       ((*(byte *)((long)puVar10 + 0xd) & 1) != 0)) goto switchD_0011920e_default;
    uVar26 = instruction->attributes;
    uVar38 = uVar26 | 0x4000000;
    instruction->attributes = uVar38;
    bVar41 = (state->prefixes).effective_segment;
    if ((uVar26 >> 0x24 & 1) == 0 && bVar41 != 0) {
      if (bVar41 < 0x3e) {
        if (bVar41 == 0x26) {
          uVar38 = 0x10004000000;
        }
        else if (bVar41 == 0x2e) {
          uVar38 = 0x2004000000;
        }
        else {
          if (bVar41 != 0x36) {
LAB_0011a966:
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                          ,0x8a2,
                          "void ZydisSetAttributes(ZydisDecoderState *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                         );
          }
          uVar38 = 0x4004000000;
        }
      }
      else if (bVar41 == 0x3e) {
        uVar38 = 0x8004000000;
      }
      else if (bVar41 == 100) {
        uVar38 = 0x20004000000;
      }
      else {
        if (bVar41 != 0x65) goto LAB_0011a966;
        uVar38 = 0x40004000000;
      }
      uVar38 = uVar38 | uVar26;
      instruction->attributes = uVar38;
    }
    if ((uVar38 & 0x7e000000000) == 0) goto switchD_0011920e_default;
LAB_001191e7:
    (instruction->raw).prefixes[(state->prefixes).offset_segment].type = ZYDIS_PREFIX_TYPE_EFFECTIVE
    ;
  }
  switch(ZVar4) {
  case ZYDIS_INSTRUCTION_ENCODING_XOP:
    uVar26 = (ulong)(pZVar47->vector_unified).LL;
    if (1 < uVar26) {
      __assert_fail("context->vector_unified.LL < (sizeof(lookup) / sizeof((lookup)[0]))",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0x90d,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    (instruction->avx).vector_length =
         *(ZyanU16 *)((long)&ZydisSetAVXInformation_lookup_65 + uVar26 * 2);
    goto switchD_0011920e_default;
  case ZYDIS_INSTRUCTION_ENCODING_REQUIRED_BITS:
    uVar26 = (ulong)(pZVar47->vector_unified).LL;
    if (1 < uVar26) {
      __assert_fail("context->vector_unified.LL < (sizeof(lookup) / sizeof((lookup)[0]))",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0x919,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    (instruction->avx).vector_length =
         *(ZyanU16 *)((long)&ZydisSetAVXInformation_lookup_65 + uVar26 * 2);
    if ((*(ushort *)((long)puVar10 + 0xc) & 0x1c0) != 0) {
      (instruction->avx).broadcast.is_static = '\x01';
      (instruction->avx).broadcast.mode =
           *(ZydisBroadcastMode *)
            (ZydisSetAVXInformation_broadcasts +
            (ulong)(*(ushort *)((long)puVar10 + 0xc) >> 6 & 7) * 4);
    }
    goto switchD_0011920e_default;
  case ZYDIS_INSTRUCTION_ENCODING_EVEX:
    bVar41 = (pZVar47->vector_unified).LL;
    bVar28 = *(byte *)((long)puVar10 + 0xc) >> 6;
    bVar42 = bVar28 - 1;
    if (bVar28 == 0) {
      bVar42 = bVar41;
    }
    if (2 < bVar42) {
      __assert_fail("vector_length < (sizeof(lookup) / sizeof((lookup)[0]))",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0x942,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    uVar26 = (ulong)bVar42;
    ZVar16 = *(ZyanU16 *)((long)&ZydisSetAVXInformation_lookup_66 + uVar26 * 2);
    (instruction->avx).vector_length = ZVar16;
    (pZVar47->evex).tuple_type = *(byte *)((long)puVar10 + 0xd) & 0x1f;
    bVar28 = *(byte *)((long)puVar10 + 0xd);
    ZVar12 = (instruction->raw).modrm.mod;
    if ((bVar28 & 0x1f) == 0) {
      if (ZVar12 != '\x03') {
        __assert_fail("instruction->raw.modrm.mod == 3",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0xa7e,
                      "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      }
      goto LAB_0011a02e;
    }
    if (ZVar12 == '\x03') {
      __assert_fail("instruction->raw.modrm.mod != 3",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0x948,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    if (bVar28 < 0x20) {
      __assert_fail("def->element_size",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0x949,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    if (0xbf < bVar28) {
      __assert_fail("def->element_size < (sizeof(element_sizes) / sizeof((element_sizes)[0]))",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0x950,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    break;
  case ZYDIS_INSTRUCTION_ENCODING_MAX_VALUE:
    (instruction->avx).vector_length = 0x200;
    uVar7 = *(uint3 *)((long)puVar10 + 0xc);
    if ((uVar7 & 0x1c000) != 0 && (uVar7 & 0x2000) != 0) {
      __assert_fail("!index || !def->broadcast",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0xad2,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    uVar19 = uVar7 >> 0xd & 1;
    uVar26 = (ulong)uVar19;
    bVar48 = true;
    if ((char)uVar19 != '\0' || (uVar7 & 0x1c000) == 0) goto LAB_0011969c;
    (instruction->avx).broadcast.is_static = '\x01';
    uVar19 = *(uint3 *)((long)puVar10 + 0xc) >> 0xe & 7;
    uVar26 = (ulong)uVar19;
    bVar48 = true;
    switch(uVar19) {
    case 1:
      ZVar37 = ZYDIS_BROADCAST_MODE_1_TO_8;
      break;
    case 2:
      uVar26 = 1;
      ZVar37 = ZYDIS_BROADCAST_MODE_1_TO_16;
      break;
    case 3:
      ZVar37 = ZYDIS_BROADCAST_MODE_4_TO_8;
      goto LAB_00119680;
    case 4:
      ZVar37 = ZYDIS_BROADCAST_MODE_4_TO_16;
LAB_00119680:
      uVar26 = 2;
      bVar48 = false;
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0xae9,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    (instruction->avx).broadcast.mode = ZVar37;
    uVar7 = *(uint3 *)((long)puVar10 + 0xc);
LAB_0011969c:
    bVar41 = (byte)(uVar7 >> 6);
    switch(uVar7 >> 6 & 0x1f) {
    case 0:
    case 1:
    case 2:
    case 3:
    case 8:
    case 9:
      goto switchD_001196bc_caseD_0;
    case 4:
    case 5:
    case 6:
    case 7:
      ZVar12 = '@';
      goto LAB_001199e4;
    case 10:
    case 0xb:
    case 0xc:
    case 0x12:
      uVar38 = (ulong)(instruction->raw).field_3.vex.size;
      if (7 < uVar38) {
        __assert_fail("instruction->raw.mvex.SSS < (sizeof(lookup[index]) / sizeof((lookup[index])[0]))"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0xb09,
                      "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      }
      puVar33 = ZydisSetAVXInformation_lookup_100;
      break;
    case 0xd:
    case 0x11:
    case 0x13:
    case 0x15:
      uVar38 = (ulong)(instruction->raw).field_3.vex.size;
      if (2 < uVar38) {
        __assert_fail("instruction->raw.mvex.SSS < (sizeof(lookup[index]) / sizeof((lookup[index])[0]))"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0xb27,
                      "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      }
      uVar26 = uVar26 * 3;
      puVar34 = (undefined2 *)(ZydisSetAVXInformation_lookup_103 + uVar38);
      goto LAB_001199df;
    case 0xe:
    case 0xf:
    case 0x10:
    case 0x14:
      uVar38 = (ulong)(instruction->raw).field_3.vex.size;
      if (7 < uVar38) {
        __assert_fail("instruction->raw.mvex.SSS < (sizeof(lookup[index]) / sizeof((lookup[index])[0]))"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0xb18,
                      "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      }
      puVar33 = ZydisSetAVXInformation_lookup_102;
      break;
    case 0x16:
    case 0x18:
      if (!bVar48) {
        __assert_fail("index < 2",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0xb33,
                      "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      }
      uVar38 = (ulong)(instruction->raw).field_3.vex.size;
      if (7 < uVar38) {
        __assert_fail("instruction->raw.mvex.SSS < (sizeof(lookup[index]) / sizeof((lookup[index])[0]))"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0xb34,
                      "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      }
      puVar33 = ZydisSetAVXInformation_lookup_104;
      break;
    case 0x17:
    case 0x19:
      if (!bVar48) {
        __assert_fail("index < 2",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0xb40,
                      "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      }
      if ((instruction->raw).field_3.vex.size != '\0') {
        __assert_fail("instruction->raw.mvex.SSS < (sizeof(lookup[index]) / sizeof((lookup[index])[0]))"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0xb41,
                      "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      }
      puVar34 = &ZydisSetAVXInformation_lookup_106;
LAB_001199df:
      pZVar35 = (ZyanU8 *)((long)puVar34 + uVar26);
      goto LAB_001199e2;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0xb46,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    pZVar35 = puVar33 + uVar38 + uVar26 * 8;
LAB_001199e2:
    ZVar12 = *pZVar35;
LAB_001199e4:
    pZVar47->cd8_scale = ZVar12;
    bVar41 = (byte)(*(ushort *)((long)puVar10 + 0xc) >> 6);
switchD_001196bc_caseD_0:
    (pZVar47->mvex).functionality = bVar41 & 0x1f;
    switch(*(ushort *)((long)puVar10 + 0xc) >> 6 & 0x1f) {
    case 0:
    case 1:
    case 4:
    case 5:
    case 6:
    case 7:
    case 0x13:
    case 0x15:
    case 0x17:
    case 0x19:
      break;
    case 2:
      bVar41 = (instruction->raw).field_3.vex.size;
      (instruction->avx).rounding.mode = (bVar41 & 3) + ZYDIS_ROUNDING_MODE_RN;
      goto LAB_00119f50;
    case 3:
      bVar41 = (instruction->raw).field_3.vex.size;
LAB_00119f50:
      if (3 < bVar41) {
        (instruction->avx).has_sae = '\x01';
      }
      break;
    case 8:
    case 9:
      (instruction->avx).swizzle.mode =
           (instruction->raw).field_3.vex.size + ZYDIS_SWIZZLE_MODE_DCBA;
      break;
    case 10:
    case 0xb:
    case 0xc:
      switch((instruction->raw).field_3.vex.size) {
      case '\0':
        break;
      case '\x01':
switchD_00119a8b_caseD_1:
        (instruction->avx).broadcast.mode = ZYDIS_BROADCAST_MODE_1_TO_16;
        break;
      case '\x02':
switchD_00119a8b_caseD_2:
        (instruction->avx).broadcast.mode = ZYDIS_BROADCAST_MODE_4_TO_16;
        break;
      case '\x03':
switchD_00119ac6_caseD_3:
        (instruction->avx).conversion.mode = ZYDIS_CONVERSION_MODE_FLOAT16;
        break;
      case '\x04':
switchD_00119af3_caseD_4:
        (instruction->avx).conversion.mode = ZYDIS_CONVERSION_MODE_REQUIRED_BITS;
        break;
      case '\x05':
switchD_00119af3_caseD_5:
        (instruction->avx).conversion.mode = ZYDIS_CONVERSION_MODE_SINT8;
        break;
      case '\x06':
switchD_00119af3_caseD_6:
        (instruction->avx).conversion.mode = ZYDIS_CONVERSION_MODE_MAX_VALUE;
        break;
      case '\a':
switchD_00119af3_caseD_7:
        (instruction->avx).conversion.mode = ZYDIS_CONVERSION_MODE_SINT16;
        break;
      default:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0xb7f,
                      "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      }
      break;
    case 0xd:
    case 0x11:
      ZVar12 = (instruction->raw).field_3.vex.size;
      if (ZVar12 != '\0') {
        if (ZVar12 == '\x02') {
          (instruction->avx).broadcast.mode = ZYDIS_BROADCAST_MODE_4_TO_8;
        }
        else {
          if (ZVar12 != '\x01') {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                          ,0xbac,
                          "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                         );
          }
          (instruction->avx).broadcast.mode = ZYDIS_BROADCAST_MODE_1_TO_8;
        }
      }
      break;
    case 0xe:
    case 0xf:
    case 0x10:
      switch((instruction->raw).field_3.vex.size) {
      case '\0':
        break;
      case '\x01':
        goto switchD_00119a8b_caseD_1;
      case '\x02':
        goto switchD_00119a8b_caseD_2;
      default:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0xb9c,
                      "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      case '\x04':
        goto switchD_00119af3_caseD_4;
      case '\x05':
        goto switchD_00119af3_caseD_5;
      case '\x06':
        goto switchD_00119af3_caseD_6;
      case '\a':
        goto switchD_00119af3_caseD_7;
      }
    case 0x12:
    case 0x16:
      switch((instruction->raw).field_3.vex.size) {
      case '\0':
        break;
      default:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0xbc5,
                      "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      case '\x03':
        goto switchD_00119ac6_caseD_3;
      case '\x04':
        goto switchD_00119af3_caseD_4;
      case '\x05':
        goto switchD_00119af3_caseD_5;
      case '\x06':
        goto switchD_00119af3_caseD_6;
      case '\a':
        goto switchD_00119af3_caseD_7;
      }
    case 0x14:
    case 0x18:
      switch((instruction->raw).field_3.vex.size) {
      case '\0':
        break;
      default:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0xbde,
                      "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      case '\x04':
        goto switchD_00119af3_caseD_4;
      case '\x05':
        goto switchD_00119af3_caseD_5;
      case '\x06':
        goto switchD_00119af3_caseD_6;
      case '\a':
        goto switchD_00119af3_caseD_7;
      }
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0xbe5,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    if (((instruction->raw).modrm.mod != '\x03') && ((instruction->raw).field_3.xop.offset != '\0'))
    {
      (instruction->avx).has_eviction_hint = '\x01';
    }
    (instruction->avx).mask.mode = ZYDIS_MASK_MODE_MERGING;
    (instruction->avx).mask.reg = (instruction->raw).field_3.evex.b + ZYDIS_REGISTER_K0;
  default:
    goto switchD_0011920e_default;
  }
  bVar45 = bVar28 >> 5;
  bVar36 = *(byte *)((long)&ZydisSetAVXInformation_element_sizes + (ulong)bVar45);
  (pZVar47->evex).element_size = bVar36;
  bVar44 = *(byte *)((long)puVar10 + 0xd);
  switch(bVar44 & 0x1f) {
  case 1:
    uVar38 = (ulong)(instruction->raw).field_3.evex.b;
    if (1 < uVar38) {
      __assert_fail("evex_b < 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0x959,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    if (uVar38 != 0) {
      bVar48 = (bVar28 & 0xc0) != 0x40;
      if ((pZVar47->vector_unified).W != '\0') {
        bVar48 = bVar45 != 4;
      }
      if (bVar48) {
        __assert_fail("!evex_b || ((!context->vector_unified.W && (context->evex.element_size == 16 || context->evex.element_size == 32)) || ( context->vector_unified.W && context->evex.element_size == 64))"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0x95c,
                      "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      }
      if ((*(ushort *)((long)puVar10 + 0xe) & 3) != 1) {
        __assert_fail("!evex_b || def->functionality == ZYDIS_EVEX_FUNC_BC",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0x95d,
                      "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      }
    }
    if (bVar45 == 5) {
      __assert_fail("size_index < 3",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0x993,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    pZVar47->cd8_scale =
         ZydisSetAVXInformation_scales[uVar26 + (ulong)(bVar36 >> 5) * 3 + uVar38 * 9];
    puVar33 = ZydisSetAVXInformation_broadcasts_73 + (ulong)(bVar36 >> 5) * 0xc + uVar38 * 0x24;
    goto LAB_00119f2c;
  case 2:
    uVar38 = (ulong)(instruction->raw).field_3.evex.b;
    if (1 < uVar38) {
      __assert_fail("evex_b < 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0x99c,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    if ((pZVar47->vector_unified).W != '\0') {
      __assert_fail("!context->vector_unified.W",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0x99d,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    if ((bVar28 & 0xc0) != 0x40) {
      __assert_fail("(context->evex.element_size == 16) || (context->evex.element_size == 32)",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0x99f,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    if ((uVar38 != 0) && ((*(ushort *)((long)puVar10 + 0xe) & 3) != 1)) {
      __assert_fail("!evex_b || def->functionality == ZYDIS_EVEX_FUNC_BC",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0x9a0,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    if (bVar45 == 5) {
      __assert_fail("size_index < 3",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0x9ca,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    lVar39 = (ulong)(bVar36 >> 5) * 3;
    pZVar47->cd8_scale = ZydisSetAVXInformation_scales_77[uVar26 + lVar39 + uVar38 * 6];
    puVar33 = ZydisSetAVXInformation_broadcasts_78 + uVar38 * 0x18;
    goto LAB_00119f28;
  case 3:
    puVar40 = &ZydisSetAVXInformation_scales_79;
    break;
  case 4:
    goto switchD_001192e3_caseD_4;
  case 5:
    if (bVar45 == 5) {
      __assert_fail("size_index < 3",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0x9ff,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    ZVar12 = *(ZyanU8 *)((long)&ZydisSetAVXInformation_scales_90 + (ulong)(bVar36 >> 5));
    goto LAB_00119fe9;
  case 6:
    if (bVar45 != 3) {
      __assert_fail("context->evex.element_size == 32",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0xa05,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    if ((pZVar47->vector_unified).W != '\0') {
      __assert_fail("context->vector_unified.W == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0xa06,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
  case 0xe:
switchD_001192e3_caseD_e:
    pZVar47->cd8_scale = '\x10';
    goto LAB_0011a02e;
  case 7:
    ZVar12 = (pZVar47->vector_unified).W;
    if (ZVar12 == '\x01') {
      if (bVar45 != 4) {
        __assert_fail("context->evex.element_size == 64",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0x9e0,
                      "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      }
    }
    else {
      if (ZVar12 != '\0') {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0x9e3,
                      "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      }
      if (bVar45 != 3) {
        __assert_fail("context->evex.element_size == 32",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0x9dd,
                      "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      }
    }
    goto switchD_001192e3_caseD_4;
  case 8:
    ZVar12 = (pZVar47->vector_unified).W;
    if (ZVar12 != '\x01') {
      if (ZVar12 != '\0') {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0xa17,
                      "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      }
      if (bVar45 != 3) {
        __assert_fail("context->evex.element_size == 32",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0xa0d,
                      "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      }
      pZVar47->cd8_scale = '\b';
      goto LAB_0011a02e;
    }
    if (bVar45 != 4) {
      __assert_fail("context->evex.element_size == 64",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0xa11,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    if ((ZVar16 != 0x100) && (ZVar16 != 0x200)) {
      __assert_fail("(instruction->avx.vector_length == 256) || (instruction->avx.vector_length == 512)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0xa13,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    goto switchD_001192e3_caseD_e;
  case 9:
    ZVar12 = (pZVar47->vector_unified).W;
    if (ZVar12 == '\x01') {
      if (bVar45 != 4) {
        __assert_fail("context->evex.element_size == 64",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0xa24,
                      "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      }
      if (bVar42 != 2) {
        __assert_fail("instruction->avx.vector_length == 512",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0xa25,
                      "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      }
      goto LAB_0011a029;
    }
    if (ZVar12 != '\0') {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0xa29,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    if (bVar45 != 3) {
      __assert_fail("context->evex.element_size == 32",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0xa1e,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    if ((ZVar16 != 0x100) && (ZVar16 != 0x200)) {
      __assert_fail("(instruction->avx.vector_length == 256) || (instruction->avx.vector_length == 512)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0xa20,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    goto switchD_001192e3_caseD_e;
  case 10:
    if ((pZVar47->vector_unified).W != '\0') {
      __assert_fail("!context->vector_unified.W",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0xa2d,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    if (bVar42 != 2) {
      __assert_fail("instruction->avx.vector_length == 512",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0xa2e,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    if (bVar45 != 3) {
      __assert_fail("context->evex.element_size == 32",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0xa2f,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
LAB_0011a029:
    pZVar47->cd8_scale = ' ';
    goto LAB_0011a02e;
  case 0xb:
    puVar40 = &ZydisSetAVXInformation_scales_88;
    break;
  case 0xc:
    puVar40 = &ZydisSetAVXInformation_scales_89;
    break;
  case 0xd:
    puVar40 = &ZydisSetAVXInformation_scales_90;
    break;
  case 0xf:
    puVar40 = &ZydisSetAVXInformation_scales_91;
    break;
  case 0x10:
    uVar38 = (ulong)(instruction->raw).field_3.evex.b;
    if (1 < uVar38) {
      __assert_fail("evex_b < 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0xa5c,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    if ((pZVar47->vector_unified).W != '\0') {
      __assert_fail("!context->vector_unified.W",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0xa5d,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    if (bVar45 != 2) {
      __assert_fail("context->evex.element_size == 16",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0xa5e,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    if ((uVar38 != 0) && ((*(ushort *)((long)puVar10 + 0xe) & 3) != 1)) {
      __assert_fail("!evex_b || def->functionality == ZYDIS_EVEX_FUNC_BC",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0xa5f,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    lVar39 = uVar38 * 3;
    pZVar47->cd8_scale = *(ZyanU8 *)((long)&ZydisSetAVXInformation_scales_93 + uVar26 + lVar39);
    puVar33 = ZydisSetAVXInformation_broadcasts_94;
LAB_00119f28:
    puVar33 = puVar33 + lVar39 * 4;
LAB_00119f2c:
    (instruction->avx).broadcast.mode = *(ZydisBroadcastMode *)(puVar33 + uVar26 * 4);
    goto LAB_0011a02e;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0xa7a,
                  "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                 );
  }
  ZVar12 = *(ZyanU8 *)(uVar26 + (long)puVar40);
LAB_00119fe9:
  pZVar47->cd8_scale = ZVar12;
LAB_0011a02e:
  if ((*(ushort *)((long)puVar10 + 0xe) & 0x780) != 0) {
    if ((instruction->avx).broadcast.mode != ZYDIS_BROADCAST_MODE_INVALID) {
      __assert_fail("!instruction->avx.broadcast.mode",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0xa84,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    (instruction->avx).broadcast.is_static = '\x01';
    uVar19 = *(ushort *)((long)puVar10 + 0xe) >> 7 & 0xf;
    if (0xc < (ushort)uVar19) {
      __assert_fail("def->broadcast < (sizeof(broadcasts) / sizeof((broadcasts)[0]))",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0xa96,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    (instruction->avx).broadcast.mode =
         *(ZydisBroadcastMode *)(ZydisSetAVXInformation_broadcasts_97 + (ulong)uVar19 * 4);
  }
  if (((instruction->raw).field_3.evex.b != '\0') &&
     (uVar14 = *(ushort *)((long)puVar10 + 0xe) & 3, 1 < uVar14)) {
    if (uVar14 != 3) {
      (instruction->avx).rounding.mode = bVar41 + ZYDIS_ROUNDING_MODE_RN;
    }
    (instruction->avx).has_sae = '\x01';
  }
  bVar41 = (instruction->raw).field_3.evex.aaa;
  (instruction->avx).mask.reg = bVar41 + ZYDIS_REGISTER_K0;
  switch(*(ushort *)((long)puVar10 + 0xe) >> 5 & 3) {
  case 0:
    iVar32 = 2;
    break;
  case 1:
    ZVar29 = ZYDIS_MASK_MODE_REQUIRED_BITS;
    goto LAB_0011a0d1;
  case 2:
    iVar32 = 4;
    break;
  case 3:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0xabc,
                  "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                 );
  }
  ZVar29 = (uint)(instruction->raw).field_3.xop.offset + iVar32;
LAB_0011a0d1:
  ZVar22 = ZYDIS_MASK_MODE_DISABLED;
  if (bVar41 != 0) {
    ZVar22 = ZVar29;
  }
  (instruction->avx).mask.mode = ZVar22;
switchD_0011920e_default:
  ZVar13 = ZydisGetAccessedFlags
                     ((ZydisInstructionDefinition *)
                      CONCAT44(local_a0._4_4_,
                               CONCAT13(local_a0._3_1_,
                                        CONCAT12(local_a0._2_1_,
                                                 CONCAT11(local_a0._1_1_,(byte)local_a0)))),
                      &local_40);
  if (ZVar13 != '\0') {
    pbVar24 = (byte *)((long)&instruction->attributes + 1);
    *pbVar24 = *pbVar24 | 2;
  }
  instruction->cpu_flags = &local_40->cpu_flags;
  instruction->fpu_flags = &local_40->fpu_flags;
  return 0x100000;
}

Assistant:

static ZyanStatus ZydisDecodeInstruction(ZydisDecoderState* state,
    ZydisDecodedInstruction* instruction)
{
    ZYAN_ASSERT(state);
    ZYAN_ASSERT(instruction);

    // Iterate through the decoder tree
    const ZydisDecoderTreeNode* node = ZydisDecoderTreeGetRootNode();
    const ZydisDecoderTreeNode* temp = ZYAN_NULL;
    ZydisDecoderTreeNodeType node_type;
    do
    {
        node_type = node->type;
        ZyanU16 index = 0;
        ZyanStatus status = 0;
        switch (node_type)
        {
        case ZYDIS_NODETYPE_INVALID:
            if (temp)
            {
                node = temp;
                temp = ZYAN_NULL;
                node_type = ZYDIS_NODETYPE_FILTER_MANDATORY_PREFIX;
                if (state->prefixes.mandatory_candidate != 0x00)
                {
                    instruction->raw.prefixes[state->prefixes.offset_mandatory].type =
                        ZYDIS_PREFIX_TYPE_IGNORED;
                }
                if (state->prefixes.mandatory_candidate == 0x66)
                {
                    if (state->prefixes.offset_osz_override ==
                        state->prefixes.offset_mandatory)
                    {
                        instruction->raw.prefixes[state->prefixes.offset_mandatory].type =
                            ZYDIS_PREFIX_TYPE_EFFECTIVE;
                    }
                    instruction->attributes |= ZYDIS_ATTRIB_HAS_OPERANDSIZE;
                }
                continue;
            }
            return ZYDIS_STATUS_DECODING_ERROR;
        case ZYDIS_NODETYPE_FILTER_XOP:
            status = ZydisNodeHandlerXOP(instruction, &index);
            break;
        case ZYDIS_NODETYPE_FILTER_VEX:
            status = ZydisNodeHandlerVEX(instruction, &index);
            break;
        case ZYDIS_NODETYPE_FILTER_EMVEX:
            status = ZydisNodeHandlerEMVEX(instruction, &index);
            break;
        case ZYDIS_NODETYPE_FILTER_OPCODE:
            status = ZydisNodeHandlerOpcode(state, instruction, &index);
            break;
        case ZYDIS_NODETYPE_FILTER_MODE:
            status = ZydisNodeHandlerMode(instruction, &index);
            break;
        case ZYDIS_NODETYPE_FILTER_MODE_COMPACT:
            status = ZydisNodeHandlerModeCompact(instruction, &index);
            break;
        case ZYDIS_NODETYPE_FILTER_MODRM_MOD:
            status = ZydisNodeHandlerModrmMod(state, instruction, &index);
            break;
        case ZYDIS_NODETYPE_FILTER_MODRM_MOD_COMPACT:
            status = ZydisNodeHandlerModrmModCompact(state, instruction, &index);
            break;
        case ZYDIS_NODETYPE_FILTER_MODRM_REG:
            status = ZydisNodeHandlerModrmReg(state, instruction, &index);
            break;
        case ZYDIS_NODETYPE_FILTER_MODRM_RM:
            status = ZydisNodeHandlerModrmRm(state, instruction, &index);
            break;
        case ZYDIS_NODETYPE_FILTER_PREFIX_GROUP1:
            index = state->prefixes.group1 ? 1 : 0;
            break;
        case ZYDIS_NODETYPE_FILTER_MANDATORY_PREFIX:
            status = ZydisNodeHandlerMandatoryPrefix(state, instruction, &index);
            temp = ZydisDecoderTreeGetChildNode(node, 0);
            // TODO: Return to this point, if index == 0 contains a value and the previous path
            // TODO: was not successful
            // TODO: Restore consumed prefix
            break;
        case ZYDIS_NODETYPE_FILTER_OPERAND_SIZE:
            status = ZydisNodeHandlerOperandSize(state, instruction, &index);
            break;
        case ZYDIS_NODETYPE_FILTER_ADDRESS_SIZE:
            status = ZydisNodeHandlerAddressSize(instruction, &index);
            break;
        case ZYDIS_NODETYPE_FILTER_VECTOR_LENGTH:
            status = ZydisNodeHandlerVectorLength(state->context, instruction, &index);
            break;
        case ZYDIS_NODETYPE_FILTER_REX_W:
            status = ZydisNodeHandlerRexW(state->context, instruction, &index);
            break;
        case ZYDIS_NODETYPE_FILTER_REX_B:
            status = ZydisNodeHandlerRexB(state->context, instruction, &index);
            break;
#ifndef ZYDIS_DISABLE_AVX512
        case ZYDIS_NODETYPE_FILTER_EVEX_B:
            status = ZydisNodeHandlerEvexB(instruction, &index);
            break;
#endif
#ifndef ZYDIS_DISABLE_KNC
        case ZYDIS_NODETYPE_FILTER_MVEX_E:
            status = ZydisNodeHandlerMvexE(instruction, &index);
            break;
#endif
        case ZYDIS_NODETYPE_FILTER_MODE_AMD:
            index = !!(state->decoder->decoder_mode & (1 << ZYDIS_DECODER_MODE_AMD_BRANCHES));
            break;
        case ZYDIS_NODETYPE_FILTER_MODE_KNC:
            index = !!(state->decoder->decoder_mode & (1 << ZYDIS_DECODER_MODE_KNC));
            break;
        case ZYDIS_NODETYPE_FILTER_MODE_MPX:
            index = !!(state->decoder->decoder_mode & (1 << ZYDIS_DECODER_MODE_MPX));
            break;
        case ZYDIS_NODETYPE_FILTER_MODE_CET:
            index = !!(state->decoder->decoder_mode & (1 << ZYDIS_DECODER_MODE_CET));
            break;
        case ZYDIS_NODETYPE_FILTER_MODE_LZCNT:
            index = !!(state->decoder->decoder_mode & (1 << ZYDIS_DECODER_MODE_LZCNT));
            break;
        case ZYDIS_NODETYPE_FILTER_MODE_TZCNT:
            index = !!(state->decoder->decoder_mode & (1 << ZYDIS_DECODER_MODE_TZCNT));
            break;
        case ZYDIS_NODETYPE_FILTER_MODE_WBNOINVD:
            index = !!(state->decoder->decoder_mode & (1 << ZYDIS_DECODER_MODE_WBNOINVD));
            break;
        case ZYDIS_NODETYPE_FILTER_MODE_CLDEMOTE:
            index = !!(state->decoder->decoder_mode & (1 << ZYDIS_DECODER_MODE_CLDEMOTE));
            break;
        case ZYDIS_NODETYPE_FILTER_MODE_IPREFETCH:
            index = !!(state->decoder->decoder_mode & (1 << ZYDIS_DECODER_MODE_IPREFETCH));
            break;
        case ZYDIS_NODETYPE_FILTER_MODE_UD0_COMPAT:
            index = !!(state->decoder->decoder_mode & (1 << ZYDIS_DECODER_MODE_UD0_COMPAT));
            break;
        default:
            if (node_type & ZYDIS_NODETYPE_DEFINITION_MASK)
            {
                const ZydisInstructionDefinition* definition;
                ZydisGetInstructionDefinition(instruction->encoding, node->value, &definition);
                ZydisSetEffectiveOperandWidth(state->context, instruction, definition);
                ZydisSetEffectiveAddressWidth(state->context, instruction, definition);

                const ZydisInstructionEncodingInfo* info;
                ZydisGetInstructionEncodingInfo(node, &info);
                ZYAN_CHECK(ZydisDecodeOptionalInstructionParts(state, instruction, info));
                ZYAN_CHECK(ZydisCheckErrorConditions(state, instruction, definition));

                if (instruction->encoding == ZYDIS_INSTRUCTION_ENCODING_3DNOW)
                {
                    // Get actual 3DNOW opcode and definition
                    ZYAN_CHECK(ZydisInputNext(state, instruction, &instruction->opcode));
                    node = ZydisDecoderTreeGetRootNode();
                    node = ZydisDecoderTreeGetChildNode(node, 0x0F);
                    node = ZydisDecoderTreeGetChildNode(node, 0x0F);
                    node = ZydisDecoderTreeGetChildNode(node, instruction->opcode);
                    if (node->type == ZYDIS_NODETYPE_INVALID)
                    {
                        return ZYDIS_STATUS_DECODING_ERROR;
                    }
                    ZYAN_ASSERT(node->type == ZYDIS_NODETYPE_FILTER_MODRM_MOD_COMPACT);
                    node = ZydisDecoderTreeGetChildNode(
                        node, (instruction->raw.modrm.mod == 0x3) ? 0 : 1);
                    ZYAN_ASSERT(node->type & ZYDIS_NODETYPE_DEFINITION_MASK);
                    ZydisGetInstructionDefinition(instruction->encoding, node->value, &definition);
                }

                instruction->mnemonic = definition->mnemonic;

#ifndef ZYDIS_MINIMAL_MODE

                instruction->operand_count = definition->operand_count;
                instruction->operand_count_visible = definition->operand_count_visible;
                state->context->definition = definition;

                instruction->meta.category = definition->category;
                instruction->meta.isa_set = definition->isa_set;
                instruction->meta.isa_ext = definition->isa_ext;
                instruction->meta.branch_type = definition->branch_type;
                ZYAN_ASSERT((instruction->meta.branch_type == ZYDIS_BRANCH_TYPE_NONE) ||
                        ((instruction->meta.category == ZYDIS_CATEGORY_CALL) ||
                         (instruction->meta.category == ZYDIS_CATEGORY_COND_BR) ||
                         (instruction->meta.category == ZYDIS_CATEGORY_UNCOND_BR) ||
                         (instruction->meta.category == ZYDIS_CATEGORY_RET)));
                instruction->meta.exception_class = definition->exception_class;

                if (!(state->decoder->decoder_mode & (1 << ZYDIS_DECODER_MODE_MINIMAL)))
                {
                    ZydisSetAttributes(state, instruction, definition);
                    switch (instruction->encoding)
                    {
                    case ZYDIS_INSTRUCTION_ENCODING_XOP:
                    case ZYDIS_INSTRUCTION_ENCODING_VEX:
                    case ZYDIS_INSTRUCTION_ENCODING_EVEX:
                    case ZYDIS_INSTRUCTION_ENCODING_MVEX:
                        ZydisSetAVXInformation(state->context, instruction, definition);
                        break;
                    default:
                        break;
                    }

                    const ZydisDefinitionAccessedFlags* flags;
                    if (ZydisGetAccessedFlags(definition, &flags))
                    {
                        instruction->attributes |= ZYDIS_ATTRIB_CPUFLAG_ACCESS;
                    }
                    instruction->cpu_flags = &flags->cpu_flags;
                    instruction->fpu_flags = &flags->fpu_flags;
                }

#endif

                return ZYAN_STATUS_SUCCESS;
            }
            ZYAN_UNREACHABLE;
        }
        ZYAN_CHECK(status);
        node = ZydisDecoderTreeGetChildNode(node, index);
    } while ((node_type != ZYDIS_NODETYPE_INVALID) && !(node_type & ZYDIS_NODETYPE_DEFINITION_MASK));
    return ZYAN_STATUS_SUCCESS;
}